

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  void *pvVar5;
  __int_type_conflict _Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  RayQueryContext *pRVar49;
  uint uVar50;
  uint uVar51;
  ulong uVar52;
  long lVar54;
  byte bVar55;
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  bool bVar59;
  ulong uVar60;
  bool bVar61;
  float fVar62;
  undefined4 uVar63;
  float fVar64;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  float fVar88;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar85;
  float fVar87;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar89;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar90;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  vint4 ai_2;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar143;
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  float fVar144;
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  float fVar159;
  float fVar176;
  float fVar177;
  vfloat4 b0_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar178;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar189;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar182 [16];
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar190;
  undefined1 auVar188 [32];
  float fVar194;
  float fVar206;
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar207;
  float fVar221;
  vfloat4 a0_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar222;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  vfloat4 a0_3;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar243;
  float fVar256;
  float fVar257;
  vfloat4 a0_1;
  undefined1 auVar248 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar258;
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar247 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  vfloat4 a0;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar270 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar282 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_628 [8];
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_548 [32];
  undefined1 local_508 [16];
  undefined1 (*local_4f8) [16];
  RayQueryContext *local_4f0;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 auStack_408 [16];
  undefined1 local_3f8 [16];
  uint auStack_3e8 [4];
  RTCFilterFunctionNArguments local_3d8;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint uStack_208;
  float afStack_204 [7];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar53;
  undefined1 auVar281 [32];
  
  PVar2 = prim[1];
  uVar60 = (ulong)(byte)PVar2;
  fVar62 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar238._0_4_ = fVar62 * auVar7._0_4_;
  auVar238._4_4_ = fVar62 * auVar7._4_4_;
  auVar238._8_4_ = fVar62 * auVar7._8_4_;
  auVar238._12_4_ = fVar62 * auVar7._12_4_;
  auVar124._0_4_ = fVar62 * auVar8._0_4_;
  auVar124._4_4_ = fVar62 * auVar8._4_4_;
  auVar124._8_4_ = fVar62 * auVar8._8_4_;
  auVar124._12_4_ = fVar62 * auVar8._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar278 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar278 = vcvtdq2ps_avx(auVar278);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar60 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar52 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + uVar60 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar52 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar268._4_4_ = auVar124._0_4_;
  auVar268._0_4_ = auVar124._0_4_;
  auVar268._8_4_ = auVar124._0_4_;
  auVar268._12_4_ = auVar124._0_4_;
  auVar92 = vshufps_avx(auVar124,auVar124,0x55);
  auVar248 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar62 = auVar248._0_4_;
  auVar236._0_4_ = fVar62 * auVar278._0_4_;
  fVar84 = auVar248._4_4_;
  auVar236._4_4_ = fVar84 * auVar278._4_4_;
  fVar86 = auVar248._8_4_;
  auVar236._8_4_ = fVar86 * auVar278._8_4_;
  fVar88 = auVar248._12_4_;
  auVar236._12_4_ = fVar88 * auVar278._12_4_;
  auVar223._0_4_ = auVar12._0_4_ * fVar62;
  auVar223._4_4_ = auVar12._4_4_ * fVar84;
  auVar223._8_4_ = auVar12._8_4_ * fVar86;
  auVar223._12_4_ = auVar12._12_4_ * fVar88;
  auVar195._0_4_ = auVar109._0_4_ * fVar62;
  auVar195._4_4_ = auVar109._4_4_ * fVar84;
  auVar195._8_4_ = auVar109._8_4_ * fVar86;
  auVar195._12_4_ = auVar109._12_4_ * fVar88;
  auVar248 = vfmadd231ps_fma(auVar236,auVar92,auVar8);
  auVar73 = vfmadd231ps_fma(auVar223,auVar92,auVar11);
  auVar92 = vfmadd231ps_fma(auVar195,auVar65,auVar92);
  auVar122 = vfmadd231ps_fma(auVar248,auVar268,auVar7);
  auVar73 = vfmadd231ps_fma(auVar73,auVar268,auVar10);
  auVar134 = vfmadd231ps_fma(auVar92,auVar66,auVar268);
  auVar269._4_4_ = auVar238._0_4_;
  auVar269._0_4_ = auVar238._0_4_;
  auVar269._8_4_ = auVar238._0_4_;
  auVar269._12_4_ = auVar238._0_4_;
  auVar92 = vshufps_avx(auVar238,auVar238,0x55);
  auVar248 = vshufps_avx(auVar238,auVar238,0xaa);
  fVar62 = auVar248._0_4_;
  auVar145._0_4_ = fVar62 * auVar278._0_4_;
  fVar84 = auVar248._4_4_;
  auVar145._4_4_ = fVar84 * auVar278._4_4_;
  fVar86 = auVar248._8_4_;
  auVar145._8_4_ = fVar86 * auVar278._8_4_;
  fVar88 = auVar248._12_4_;
  auVar145._12_4_ = fVar88 * auVar278._12_4_;
  auVar91._0_4_ = auVar12._0_4_ * fVar62;
  auVar91._4_4_ = auVar12._4_4_ * fVar84;
  auVar91._8_4_ = auVar12._8_4_ * fVar86;
  auVar91._12_4_ = auVar12._12_4_ * fVar88;
  auVar248._0_4_ = auVar109._0_4_ * fVar62;
  auVar248._4_4_ = auVar109._4_4_ * fVar84;
  auVar248._8_4_ = auVar109._8_4_ * fVar86;
  auVar248._12_4_ = auVar109._12_4_ * fVar88;
  auVar8 = vfmadd231ps_fma(auVar145,auVar92,auVar8);
  auVar278 = vfmadd231ps_fma(auVar91,auVar92,auVar11);
  auVar11 = vfmadd231ps_fma(auVar248,auVar92,auVar65);
  auVar12 = vfmadd231ps_fma(auVar8,auVar269,auVar7);
  auVar65 = vfmadd231ps_fma(auVar278,auVar269,auVar10);
  auVar109 = vfmadd231ps_fma(auVar11,auVar269,auVar66);
  auVar244._8_4_ = 0x7fffffff;
  auVar244._0_8_ = 0x7fffffff7fffffff;
  auVar244._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar122,auVar244);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar133,1);
  auVar8 = vblendvps_avx(auVar122,auVar133,auVar7);
  auVar7 = vandps_avx(auVar73,auVar244);
  auVar7 = vcmpps_avx(auVar7,auVar133,1);
  auVar278 = vblendvps_avx(auVar73,auVar133,auVar7);
  auVar7 = vandps_avx(auVar134,auVar244);
  auVar7 = vcmpps_avx(auVar7,auVar133,1);
  auVar7 = vblendvps_avx(auVar134,auVar133,auVar7);
  auVar10 = vrcpps_avx(auVar8);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar10,auVar179);
  auVar10 = vfmadd132ps_fma(auVar8,auVar10,auVar10);
  auVar8 = vrcpps_avx(auVar278);
  auVar278 = vfnmadd213ps_fma(auVar278,auVar8,auVar179);
  auVar11 = vfmadd132ps_fma(auVar278,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar8,auVar179);
  auVar66 = vfmadd132ps_fma(auVar7,auVar8,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar134._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar134._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar134._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar134._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar146._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar146._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar146._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar146._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar73._1_3_ = 0;
  auVar73[0] = PVar2;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar278);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar60 * -2 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar65);
  auVar196._0_4_ = auVar7._0_4_ * auVar11._0_4_;
  auVar196._4_4_ = auVar7._4_4_ * auVar11._4_4_;
  auVar196._8_4_ = auVar7._8_4_ * auVar11._8_4_;
  auVar196._12_4_ = auVar7._12_4_ * auVar11._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar8);
  auVar7 = vsubps_avx(auVar7,auVar65);
  auVar92._0_4_ = auVar11._0_4_ * auVar7._0_4_;
  auVar92._4_4_ = auVar11._4_4_ * auVar7._4_4_;
  auVar92._8_4_ = auVar11._8_4_ * auVar7._8_4_;
  auVar92._12_4_ = auVar11._12_4_ * auVar7._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar52 + uVar60 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar109);
  auVar122._0_4_ = auVar66._0_4_ * auVar7._0_4_;
  auVar122._4_4_ = auVar66._4_4_ * auVar7._4_4_;
  auVar122._8_4_ = auVar66._8_4_ * auVar7._8_4_;
  auVar122._12_4_ = auVar66._12_4_ * auVar7._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar12);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar109);
  auVar65._0_4_ = auVar66._0_4_ * auVar7._0_4_;
  auVar65._4_4_ = auVar66._4_4_ * auVar7._4_4_;
  auVar65._8_4_ = auVar66._8_4_ * auVar7._8_4_;
  auVar65._12_4_ = auVar66._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar134,auVar146);
  auVar8 = vpminsd_avx(auVar196,auVar92);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar122,auVar65);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar208._4_4_ = uVar63;
  auVar208._0_4_ = uVar63;
  auVar208._8_4_ = uVar63;
  auVar208._12_4_ = uVar63;
  auVar8 = vmaxps_avx(auVar8,auVar208);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_348._0_4_ = auVar7._0_4_ * 0.99999964;
  local_348._4_4_ = auVar7._4_4_ * 0.99999964;
  local_348._8_4_ = auVar7._8_4_ * 0.99999964;
  local_348._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar134,auVar146);
  auVar8 = vpmaxsd_avx(auVar196,auVar92);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar122,auVar65);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar109._4_4_ = uVar63;
  auVar109._0_4_ = uVar63;
  auVar109._8_4_ = uVar63;
  auVar109._12_4_ = uVar63;
  auVar8 = vminps_avx(auVar8,auVar109);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar66._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar73[4] = PVar2;
  auVar73._5_3_ = 0;
  auVar73[8] = PVar2;
  auVar73._9_3_ = 0;
  auVar73[0xc] = PVar2;
  auVar73._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar73,_DAT_01f7fcf0);
  auVar7 = vcmpps_avx(local_348,auVar66,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  uVar50 = vmovmskps_avx(auVar7);
  if (uVar50 == 0) {
    return false;
  }
  uVar50 = uVar50 & 0xff;
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  local_4f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_4f0 = context;
LAB_015a9426:
  pRVar49 = local_4f0;
  lVar54 = 0;
  uVar60 = (ulong)uVar50;
  for (uVar52 = uVar60; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    lVar54 = lVar54 + 1;
  }
  uVar50 = *(uint *)(prim + 2);
  local_368 = *(uint *)(prim + lVar54 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar50].ptr;
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_368);
  p_Var4 = pGVar3[1].intersectionFilterN;
  pvVar5 = pGVar3[2].userPtr;
  _Var6 = pGVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar7 = *(undefined1 (*) [16])(_Var6 + uVar52 * (long)pvVar5);
  auVar8 = *(undefined1 (*) [16])(_Var6 + (uVar52 + 1) * (long)pvVar5);
  auVar278 = *(undefined1 (*) [16])(_Var6 + (uVar52 + 2) * (long)pvVar5);
  auVar10 = *(undefined1 (*) [16])(_Var6 + (long)pvVar5 * (uVar52 + 3));
  lVar54 = *(long *)&pGVar3[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar54 + (long)p_Var4 * uVar52);
  auVar12 = *(undefined1 (*) [16])(lVar54 + (long)p_Var4 * (uVar52 + 1));
  auVar66 = *(undefined1 (*) [16])(lVar54 + (long)p_Var4 * (uVar52 + 2));
  uVar60 = uVar60 - 1 & uVar60;
  auVar65 = *(undefined1 (*) [16])(lVar54 + (long)p_Var4 * (uVar52 + 3));
  if (uVar60 != 0) {
    uVar58 = uVar60 - 1 & uVar60;
    for (uVar52 = uVar60; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar109 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar109 = vinsertps_avx(auVar109,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar122 = ZEXT816(0) << 0x40;
  auVar93._0_4_ = auVar65._0_4_ * 0.0;
  auVar93._4_4_ = auVar65._4_4_ * 0.0;
  auVar93._8_4_ = auVar65._8_4_ * 0.0;
  auVar93._12_4_ = auVar65._12_4_ * 0.0;
  auVar248 = vfmadd231ps_fma(auVar93,auVar66,auVar122);
  auVar92 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar248);
  local_608._0_4_ = auVar11._0_4_ + auVar92._0_4_;
  local_608._4_4_ = auVar11._4_4_ + auVar92._4_4_;
  fStack_600 = auVar11._8_4_ + auVar92._8_4_;
  fStack_5fc = auVar11._12_4_ + auVar92._12_4_;
  auVar270._8_4_ = 0x40400000;
  auVar270._0_8_ = 0x4040000040400000;
  auVar270._12_4_ = 0x40400000;
  auVar92 = vfmadd231ps_fma(auVar248,auVar12,auVar270);
  auVar73 = vfnmadd231ps_fma(auVar92,auVar11,auVar270);
  auVar245._0_4_ = auVar10._0_4_ * 0.0;
  auVar245._4_4_ = auVar10._4_4_ * 0.0;
  auVar245._8_4_ = auVar10._8_4_ * 0.0;
  auVar245._12_4_ = auVar10._12_4_ * 0.0;
  auVar248 = vfmadd231ps_fma(auVar245,auVar278,auVar122);
  auVar92 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar8,auVar248);
  auVar259._0_4_ = auVar7._0_4_ + auVar92._0_4_;
  auVar259._4_4_ = auVar7._4_4_ + auVar92._4_4_;
  auVar259._8_4_ = auVar7._8_4_ + auVar92._8_4_;
  auVar259._12_4_ = auVar7._12_4_ + auVar92._12_4_;
  auVar92 = vfmadd231ps_fma(auVar248,auVar8,auVar270);
  auVar248 = vfnmadd231ps_fma(auVar92,auVar7,auVar270);
  auVar92 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar66,auVar65);
  auVar92 = vfmadd231ps_fma(auVar92,auVar12,auVar122);
  auVar92 = vfmadd231ps_fma(auVar92,auVar11,auVar122);
  auVar135._0_4_ = auVar65._0_4_ * 3.0;
  auVar135._4_4_ = auVar65._4_4_ * 3.0;
  auVar135._8_4_ = auVar65._8_4_ * 3.0;
  auVar135._12_4_ = auVar65._12_4_ * 3.0;
  auVar66 = vfnmadd231ps_fma(auVar135,auVar270,auVar66);
  auVar12 = vfmadd231ps_fma(auVar66,auVar122,auVar12);
  auVar66 = vfnmadd231ps_fma(auVar12,auVar122,auVar11);
  auVar11 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar278,auVar10);
  auVar11 = vfmadd231ps_fma(auVar11,auVar8,auVar122);
  auVar11 = vfmadd231ps_fma(auVar11,auVar7,auVar122);
  auVar224._0_4_ = auVar10._0_4_ * 3.0;
  auVar224._4_4_ = auVar10._4_4_ * 3.0;
  auVar224._8_4_ = auVar10._8_4_ * 3.0;
  auVar224._12_4_ = auVar10._12_4_ * 3.0;
  auVar278 = vfnmadd231ps_fma(auVar224,auVar270,auVar278);
  auVar8 = vfmadd231ps_fma(auVar278,auVar122,auVar8);
  auVar12 = vfnmadd231ps_fma(auVar8,auVar122,auVar7);
  auVar7 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar8 = vshufps_avx(auVar259,auVar259,0xc9);
  fVar121 = auVar73._0_4_;
  auVar160._0_4_ = fVar121 * auVar8._0_4_;
  fVar85 = auVar73._4_4_;
  auVar160._4_4_ = fVar85 * auVar8._4_4_;
  fVar87 = auVar73._8_4_;
  auVar160._8_4_ = fVar87 * auVar8._8_4_;
  fVar144 = auVar73._12_4_;
  auVar160._12_4_ = fVar144 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar160,auVar7,auVar259);
  auVar278 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar248,auVar248,0xc9);
  auVar161._0_4_ = fVar121 * auVar8._0_4_;
  auVar161._4_4_ = fVar85 * auVar8._4_4_;
  auVar161._8_4_ = fVar87 * auVar8._8_4_;
  auVar161._12_4_ = fVar144 * auVar8._12_4_;
  auVar7 = vfmsub231ps_fma(auVar161,auVar7,auVar248);
  auVar10 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar8 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar64 = auVar66._0_4_;
  auVar147._0_4_ = fVar64 * auVar8._0_4_;
  fVar222 = auVar66._4_4_;
  auVar147._4_4_ = fVar222 * auVar8._4_4_;
  fVar132 = auVar66._8_4_;
  auVar147._8_4_ = fVar132 * auVar8._8_4_;
  fVar143 = auVar66._12_4_;
  auVar147._12_4_ = fVar143 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar147,auVar7,auVar11);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar180._0_4_ = fVar64 * auVar8._0_4_;
  auVar180._4_4_ = fVar222 * auVar8._4_4_;
  auVar180._8_4_ = fVar132 * auVar8._8_4_;
  auVar180._12_4_ = fVar143 * auVar8._12_4_;
  auVar7 = vfmsub231ps_fma(auVar180,auVar7,auVar12);
  auVar12 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vdpps_avx(auVar278,auVar278,0x7f);
  fVar84 = auVar7._0_4_;
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = fVar84;
  auVar8 = vrsqrtss_avx(auVar225,auVar225);
  fVar62 = auVar8._0_4_;
  fVar86 = fVar62 * 1.5 - fVar84 * 0.5 * fVar62 * fVar62 * fVar62;
  auVar8 = vdpps_avx(auVar278,auVar10,0x7f);
  fVar159 = auVar278._0_4_ * fVar86;
  fVar176 = auVar278._4_4_ * fVar86;
  fVar177 = auVar278._8_4_ * fVar86;
  fVar178 = auVar278._12_4_ * fVar86;
  auVar237._0_4_ = auVar10._0_4_ * fVar84;
  auVar237._4_4_ = auVar10._4_4_ * fVar84;
  auVar237._8_4_ = auVar10._8_4_ * fVar84;
  auVar237._12_4_ = auVar10._12_4_ * fVar84;
  fVar62 = auVar8._0_4_;
  auVar197._0_4_ = auVar278._0_4_ * fVar62;
  auVar197._4_4_ = auVar278._4_4_ * fVar62;
  auVar197._8_4_ = auVar278._8_4_ * fVar62;
  auVar197._12_4_ = auVar278._12_4_ * fVar62;
  auVar278 = vsubps_avx(auVar237,auVar197);
  auVar8 = vrcpss_avx(auVar225,auVar225);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar62 = auVar8._0_4_ * auVar7._0_4_;
  auVar7 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar84 = auVar7._0_4_;
  auVar226._4_12_ = ZEXT812(0) << 0x20;
  auVar226._0_4_ = fVar84;
  auVar8 = vrsqrtss_avx(auVar226,auVar226);
  fVar88 = auVar8._0_4_;
  auVar8 = vdpps_avx(auVar11,auVar12,0x7f);
  fVar88 = fVar88 * 1.5 - fVar84 * 0.5 * fVar88 * fVar88 * fVar88;
  fVar243 = fVar88 * auVar11._0_4_;
  fVar256 = fVar88 * auVar11._4_4_;
  fVar257 = fVar88 * auVar11._8_4_;
  fVar258 = fVar88 * auVar11._12_4_;
  auVar181._0_4_ = fVar84 * auVar12._0_4_;
  auVar181._4_4_ = fVar84 * auVar12._4_4_;
  auVar181._8_4_ = fVar84 * auVar12._8_4_;
  auVar181._12_4_ = fVar84 * auVar12._12_4_;
  fVar84 = auVar8._0_4_;
  auVar148._0_4_ = fVar84 * auVar11._0_4_;
  auVar148._4_4_ = fVar84 * auVar11._4_4_;
  auVar148._8_4_ = fVar84 * auVar11._8_4_;
  auVar148._12_4_ = fVar84 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar181,auVar148);
  auVar8 = vrcpss_avx(auVar226,auVar226);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,ZEXT416(0x40000000));
  fVar84 = auVar7._0_4_ * auVar8._0_4_;
  auVar7 = vshufps_avx(_local_608,_local_608,0xff);
  auVar209._0_4_ = auVar7._0_4_ * fVar159;
  auVar209._4_4_ = auVar7._4_4_ * fVar176;
  auVar209._8_4_ = auVar7._8_4_ * fVar177;
  auVar209._12_4_ = auVar7._12_4_ * fVar178;
  local_468 = vsubps_avx(_local_608,auVar209);
  auVar8 = vshufps_avx(auVar73,auVar73,0xff);
  auVar162._0_4_ = auVar8._0_4_ * fVar159 + fVar86 * auVar278._0_4_ * fVar62 * auVar7._0_4_;
  auVar162._4_4_ = auVar8._4_4_ * fVar176 + fVar86 * auVar278._4_4_ * fVar62 * auVar7._4_4_;
  auVar162._8_4_ = auVar8._8_4_ * fVar177 + fVar86 * auVar278._8_4_ * fVar62 * auVar7._8_4_;
  auVar162._12_4_ = auVar8._12_4_ * fVar178 + fVar86 * auVar278._12_4_ * fVar62 * auVar7._12_4_;
  auVar278 = vsubps_avx(auVar73,auVar162);
  local_478._0_4_ = auVar209._0_4_ + (float)local_608._0_4_;
  local_478._4_4_ = auVar209._4_4_ + (float)local_608._4_4_;
  fStack_470 = auVar209._8_4_ + fStack_600;
  fStack_46c = auVar209._12_4_ + fStack_5fc;
  auVar7 = vshufps_avx(auVar92,auVar92,0xff);
  auVar110._0_4_ = fVar243 * auVar7._0_4_;
  auVar110._4_4_ = fVar256 * auVar7._4_4_;
  auVar110._8_4_ = fVar257 * auVar7._8_4_;
  auVar110._12_4_ = fVar258 * auVar7._12_4_;
  local_488 = vsubps_avx(auVar92,auVar110);
  auVar8 = vshufps_avx(auVar66,auVar66,0xff);
  auVar94._0_4_ = fVar243 * auVar8._0_4_ + auVar7._0_4_ * fVar88 * auVar10._0_4_ * fVar84;
  auVar94._4_4_ = fVar256 * auVar8._4_4_ + auVar7._4_4_ * fVar88 * auVar10._4_4_ * fVar84;
  auVar94._8_4_ = fVar257 * auVar8._8_4_ + auVar7._8_4_ * fVar88 * auVar10._8_4_ * fVar84;
  auVar94._12_4_ = fVar258 * auVar8._12_4_ + auVar7._12_4_ * fVar88 * auVar10._12_4_ * fVar84;
  auVar7 = vsubps_avx(auVar66,auVar94);
  fVar159 = auVar92._0_4_ + auVar110._0_4_;
  fVar176 = auVar92._4_4_ + auVar110._4_4_;
  fVar177 = auVar92._8_4_ + auVar110._8_4_;
  fVar178 = auVar92._12_4_ + auVar110._12_4_;
  local_498._0_4_ = local_468._0_4_ + auVar278._0_4_ * 0.33333334;
  local_498._4_4_ = local_468._4_4_ + auVar278._4_4_ * 0.33333334;
  local_498._8_4_ = local_468._8_4_ + auVar278._8_4_ * 0.33333334;
  local_498._12_4_ = local_468._12_4_ + auVar278._12_4_ * 0.33333334;
  auVar95._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar95._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar95._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar95._12_4_ = auVar7._12_4_ * 0.33333334;
  local_4a8 = vsubps_avx(local_488,auVar95);
  local_448 = vsubps_avx(local_468,auVar109);
  auVar7 = vshufps_avx(local_448,local_448,0x55);
  auVar8 = vshufps_avx(local_448,local_448,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar62 = pre->ray_space[k].vz.field_0.m128[0];
  fVar84 = pre->ray_space[k].vz.field_0.m128[1];
  fVar86 = pre->ray_space[k].vz.field_0.m128[2];
  fVar88 = pre->ray_space[k].vz.field_0.m128[3];
  auVar96._0_4_ = fVar62 * auVar8._0_4_;
  auVar96._4_4_ = fVar84 * auVar8._4_4_;
  auVar96._8_4_ = fVar86 * auVar8._8_4_;
  auVar96._12_4_ = fVar88 * auVar8._12_4_;
  auVar278 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar1,auVar7);
  local_458 = vsubps_avx(local_498,auVar109);
  auVar7 = vshufps_avx(local_458,local_458,0x55);
  auVar8 = vshufps_avx(local_458,local_458,0xaa);
  auVar276._0_4_ = fVar62 * auVar8._0_4_;
  auVar276._4_4_ = fVar84 * auVar8._4_4_;
  auVar276._8_4_ = fVar86 * auVar8._8_4_;
  auVar276._12_4_ = fVar88 * auVar8._12_4_;
  auVar8 = vfmadd231ps_fma(auVar276,(undefined1  [16])aVar1,auVar7);
  local_2d8 = vsubps_avx(local_4a8,auVar109);
  auVar7 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar246._0_4_ = fVar62 * auVar7._0_4_;
  auVar246._4_4_ = fVar84 * auVar7._4_4_;
  auVar246._8_4_ = fVar86 * auVar7._8_4_;
  auVar246._12_4_ = fVar88 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar10 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar1,auVar7);
  local_2e8 = vsubps_avx(local_488,auVar109);
  auVar7 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar260._0_4_ = fVar62 * auVar7._0_4_;
  auVar260._4_4_ = fVar84 * auVar7._4_4_;
  auVar260._8_4_ = fVar86 * auVar7._8_4_;
  auVar260._12_4_ = fVar88 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar11 = vfmadd231ps_fma(auVar260,(undefined1  [16])aVar1,auVar7);
  local_2f8 = vsubps_avx(_local_478,auVar109);
  auVar7 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar149._0_4_ = fVar62 * auVar7._0_4_;
  auVar149._4_4_ = fVar84 * auVar7._4_4_;
  auVar149._8_4_ = fVar86 * auVar7._8_4_;
  auVar149._12_4_ = fVar88 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar12 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar1,auVar7);
  local_4b8._0_4_ = (fVar121 + auVar162._0_4_) * 0.33333334 + (float)local_478._0_4_;
  local_4b8._4_4_ = (fVar85 + auVar162._4_4_) * 0.33333334 + (float)local_478._4_4_;
  fStack_4b0 = (fVar87 + auVar162._8_4_) * 0.33333334 + fStack_470;
  fStack_4ac = (fVar144 + auVar162._12_4_) * 0.33333334 + fStack_46c;
  local_308 = vsubps_avx(_local_4b8,auVar109);
  auVar7 = vshufps_avx(local_308,local_308,0xaa);
  auVar198._0_4_ = auVar7._0_4_ * fVar62;
  auVar198._4_4_ = auVar7._4_4_ * fVar84;
  auVar198._8_4_ = auVar7._8_4_ * fVar86;
  auVar198._12_4_ = auVar7._12_4_ * fVar88;
  auVar7 = vshufps_avx(local_308,local_308,0x55);
  auVar66 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar1,auVar7);
  auVar210._0_4_ = (fVar64 + auVar94._0_4_) * 0.33333334;
  auVar210._4_4_ = (fVar222 + auVar94._4_4_) * 0.33333334;
  auVar210._8_4_ = (fVar132 + auVar94._8_4_) * 0.33333334;
  auVar210._12_4_ = (fVar143 + auVar94._12_4_) * 0.33333334;
  auVar43._4_4_ = fVar176;
  auVar43._0_4_ = fVar159;
  auVar43._8_4_ = fVar177;
  auVar43._12_4_ = fVar178;
  _local_4c8 = vsubps_avx(auVar43,auVar210);
  local_318 = vsubps_avx(_local_4c8,auVar109);
  auVar7 = vshufps_avx(local_318,local_318,0xaa);
  auVar211._0_4_ = auVar7._0_4_ * fVar62;
  auVar211._4_4_ = auVar7._4_4_ * fVar84;
  auVar211._8_4_ = auVar7._8_4_ * fVar86;
  auVar211._12_4_ = auVar7._12_4_ * fVar88;
  auVar7 = vshufps_avx(local_318,local_318,0x55);
  auVar65 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar1,auVar7);
  local_328 = vsubps_avx(auVar43,auVar109);
  auVar7 = vshufps_avx(local_328,local_328,0xaa);
  auVar67._0_4_ = fVar62 * auVar7._0_4_;
  auVar67._4_4_ = fVar84 * auVar7._4_4_;
  auVar67._8_4_ = fVar86 * auVar7._8_4_;
  auVar67._12_4_ = fVar88 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_328,local_328,0x55);
  auVar7 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar1,auVar7);
  auVar163._4_4_ = local_448._0_4_;
  auVar163._0_4_ = local_448._0_4_;
  auVar163._8_4_ = local_448._0_4_;
  auVar163._12_4_ = local_448._0_4_;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar109 = vfmadd231ps_fma(auVar278,(undefined1  [16])aVar1,auVar163);
  auVar164._4_4_ = local_458._0_4_;
  auVar164._0_4_ = local_458._0_4_;
  auVar164._8_4_ = local_458._0_4_;
  auVar164._12_4_ = local_458._0_4_;
  auVar92 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar164);
  uVar63 = local_2d8._0_4_;
  auVar165._4_4_ = uVar63;
  auVar165._0_4_ = uVar63;
  auVar165._8_4_ = uVar63;
  auVar165._12_4_ = uVar63;
  auVar248 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar165);
  uVar63 = local_2e8._0_4_;
  auVar166._4_4_ = uVar63;
  auVar166._0_4_ = uVar63;
  auVar166._8_4_ = uVar63;
  auVar166._12_4_ = uVar63;
  auVar73 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar166);
  uVar63 = local_2f8._0_4_;
  auVar167._4_4_ = uVar63;
  auVar167._0_4_ = uVar63;
  auVar167._8_4_ = uVar63;
  auVar167._12_4_ = uVar63;
  auVar12 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar1,auVar167);
  uVar63 = local_308._0_4_;
  auVar168._4_4_ = uVar63;
  auVar168._0_4_ = uVar63;
  auVar168._8_4_ = uVar63;
  auVar168._12_4_ = uVar63;
  auVar66 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar1,auVar168);
  uVar63 = local_318._0_4_;
  auVar169._4_4_ = uVar63;
  auVar169._0_4_ = uVar63;
  auVar169._8_4_ = uVar63;
  auVar169._12_4_ = uVar63;
  auVar65 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar169);
  uVar63 = local_328._0_4_;
  auVar170._4_4_ = uVar63;
  auVar170._0_4_ = uVar63;
  auVar170._8_4_ = uVar63;
  auVar170._12_4_ = uVar63;
  auVar122 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar1,auVar170);
  auVar10 = vmovlhps_avx(auVar109,auVar12);
  auVar11 = vmovlhps_avx(auVar92,auVar66);
  local_3f8 = vmovlhps_avx(auVar248,auVar65);
  _local_2c8 = vmovlhps_avx(auVar73,auVar122);
  auVar7 = vminps_avx(auVar10,auVar11);
  auVar8 = vminps_avx(local_3f8,_local_2c8);
  auVar278 = vminps_avx(auVar7,auVar8);
  auVar7 = vmaxps_avx(auVar10,auVar11);
  auVar8 = vmaxps_avx(local_3f8,_local_2c8);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vshufpd_avx(auVar278,auVar278,3);
  auVar278 = vminps_avx(auVar278,auVar8);
  auVar8 = vshufpd_avx(auVar7,auVar7,3);
  auVar8 = vmaxps_avx(auVar7,auVar8);
  auVar7 = vandps_avx(auVar244,auVar278);
  auVar8 = vandps_avx(auVar244,auVar8);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vmovshdup_avx(auVar7);
  auVar7 = vmaxss_avx(auVar8,auVar7);
  fVar84 = auVar7._0_4_ * 9.536743e-07;
  auVar182._8_8_ = auVar109._0_8_;
  auVar182._0_8_ = auVar109._0_8_;
  auVar227._8_8_ = auVar92._0_8_;
  auVar227._0_8_ = auVar92._0_8_;
  auVar247._0_8_ = auVar248._0_8_;
  auVar247._8_8_ = auVar247._0_8_;
  auVar261._0_8_ = auVar73._0_8_;
  auVar261._8_8_ = auVar261._0_8_;
  local_248 = -fVar84;
  fStack_244 = local_248;
  fStack_240 = local_248;
  fStack_23c = local_248;
  fStack_238 = local_248;
  fStack_234 = local_248;
  fStack_230 = local_248;
  fStack_22c = local_248;
  local_358 = uVar50;
  uStack_354 = uVar50;
  uStack_350 = uVar50;
  uStack_34c = uVar50;
  uStack_364 = local_368;
  uStack_360 = local_368;
  uStack_35c = local_368;
  bVar59 = false;
  uVar52 = 0;
  fVar62 = *(float *)(ray + k * 4 + 0x30);
  local_298 = vsubps_avx(auVar11,auVar10);
  local_2a8 = vsubps_avx(local_3f8,auVar11);
  local_2b8 = vsubps_avx(_local_2c8,local_3f8);
  local_378 = vsubps_avx(_local_478,local_468);
  local_388 = vsubps_avx(_local_4b8,local_498);
  local_398 = vsubps_avx(_local_4c8,local_4a8);
  auVar44._4_4_ = fVar176;
  auVar44._0_4_ = fVar159;
  auVar44._8_4_ = fVar177;
  auVar44._12_4_ = fVar178;
  _local_3a8 = vsubps_avx(auVar44,local_488);
  auVar68 = ZEXT816(0x3f80000000000000);
  local_228 = fVar84;
  fStack_224 = fVar84;
  fStack_220 = fVar84;
  fStack_21c = fVar84;
  fStack_218 = fVar84;
  fStack_214 = fVar84;
  fStack_210 = fVar84;
  fStack_20c = fVar84;
  local_338 = auVar68;
LAB_015a9bbb:
  auVar7 = vshufps_avx(auVar68,auVar68,0x50);
  auVar277._8_4_ = 0x3f800000;
  auVar277._0_8_ = 0x3f8000003f800000;
  auVar277._12_4_ = 0x3f800000;
  auVar281._16_4_ = 0x3f800000;
  auVar281._0_16_ = auVar277;
  auVar281._20_4_ = 0x3f800000;
  auVar281._24_4_ = 0x3f800000;
  auVar281._28_4_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar277,auVar7);
  fVar86 = auVar7._0_4_;
  fVar132 = auVar12._0_4_;
  auVar69._0_4_ = fVar132 * fVar86;
  fVar88 = auVar7._4_4_;
  fVar143 = auVar12._4_4_;
  auVar69._4_4_ = fVar143 * fVar88;
  fVar121 = auVar7._8_4_;
  auVar69._8_4_ = fVar132 * fVar121;
  fVar85 = auVar7._12_4_;
  auVar69._12_4_ = fVar143 * fVar85;
  fVar243 = auVar66._0_4_;
  auVar171._0_4_ = fVar243 * fVar86;
  fVar256 = auVar66._4_4_;
  auVar171._4_4_ = fVar256 * fVar88;
  auVar171._8_4_ = fVar243 * fVar121;
  auVar171._12_4_ = fVar256 * fVar85;
  fVar194 = auVar65._0_4_;
  auVar136._0_4_ = fVar194 * fVar86;
  fVar206 = auVar65._4_4_;
  auVar136._4_4_ = fVar206 * fVar88;
  auVar136._8_4_ = fVar194 * fVar121;
  auVar136._12_4_ = fVar206 * fVar85;
  fVar207 = auVar122._0_4_;
  auVar111._0_4_ = fVar207 * fVar86;
  fVar221 = auVar122._4_4_;
  auVar111._4_4_ = fVar221 * fVar88;
  auVar111._8_4_ = fVar207 * fVar121;
  auVar111._12_4_ = fVar221 * fVar85;
  auVar92 = vfmadd231ps_fma(auVar69,auVar8,auVar182);
  auVar248 = vfmadd231ps_fma(auVar171,auVar8,auVar227);
  auVar73 = vfmadd231ps_fma(auVar136,auVar8,auVar247);
  auVar134 = vfmadd231ps_fma(auVar111,auVar261,auVar8);
  auVar7 = vmovshdup_avx(local_338);
  fVar86 = local_338._0_4_;
  fStack_e0 = (auVar7._0_4_ - fVar86) * 0.04761905;
  auVar219._4_4_ = fVar86;
  auVar219._0_4_ = fVar86;
  auVar219._8_4_ = fVar86;
  auVar219._12_4_ = fVar86;
  auVar219._16_4_ = fVar86;
  auVar219._20_4_ = fVar86;
  auVar219._24_4_ = fVar86;
  auVar219._28_4_ = fVar86;
  auVar105._0_8_ = auVar7._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  auVar81 = vsubps_avx(auVar105,auVar219);
  uVar63 = auVar92._0_4_;
  auVar274._4_4_ = uVar63;
  auVar274._0_4_ = uVar63;
  auVar274._8_4_ = uVar63;
  auVar274._12_4_ = uVar63;
  auVar274._16_4_ = uVar63;
  auVar274._20_4_ = uVar63;
  auVar274._24_4_ = uVar63;
  auVar274._28_4_ = uVar63;
  auVar7 = vmovshdup_avx(auVar92);
  uVar90 = auVar7._0_8_;
  auVar267._8_8_ = uVar90;
  auVar267._0_8_ = uVar90;
  auVar267._16_8_ = uVar90;
  auVar267._24_8_ = uVar90;
  fVar257 = auVar248._0_4_;
  auVar253._4_4_ = fVar257;
  auVar253._0_4_ = fVar257;
  auVar253._8_4_ = fVar257;
  auVar253._12_4_ = fVar257;
  auVar253._16_4_ = fVar257;
  auVar253._20_4_ = fVar257;
  auVar253._24_4_ = fVar257;
  auVar253._28_4_ = fVar257;
  auVar8 = vmovshdup_avx(auVar248);
  auVar106._0_8_ = auVar8._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  fVar222 = auVar73._0_4_;
  auVar186._4_4_ = fVar222;
  auVar186._0_4_ = fVar222;
  auVar186._8_4_ = fVar222;
  auVar186._12_4_ = fVar222;
  auVar186._16_4_ = fVar222;
  auVar186._20_4_ = fVar222;
  auVar186._24_4_ = fVar222;
  auVar186._28_4_ = fVar222;
  auVar278 = vmovshdup_avx(auVar73);
  auVar204._0_8_ = auVar278._0_8_;
  auVar204._8_8_ = auVar204._0_8_;
  auVar204._16_8_ = auVar204._0_8_;
  auVar204._24_8_ = auVar204._0_8_;
  fVar64 = auVar134._0_4_;
  auVar109 = vmovshdup_avx(auVar134);
  auVar238 = vfmadd132ps_fma(auVar81,auVar219,_DAT_01faff20);
  auVar81 = vsubps_avx(auVar281,ZEXT1632(auVar238));
  fVar86 = auVar238._0_4_;
  fVar88 = auVar238._4_4_;
  auVar13._4_4_ = fVar257 * fVar88;
  auVar13._0_4_ = fVar257 * fVar86;
  fVar121 = auVar238._8_4_;
  auVar13._8_4_ = fVar257 * fVar121;
  fVar85 = auVar238._12_4_;
  auVar13._12_4_ = fVar257 * fVar85;
  auVar13._16_4_ = fVar257 * 0.0;
  auVar13._20_4_ = fVar257 * 0.0;
  auVar13._24_4_ = fVar257 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar238 = vfmadd231ps_fma(auVar13,auVar81,auVar274);
  fVar87 = auVar8._0_4_;
  fVar144 = auVar8._4_4_;
  auVar14._4_4_ = fVar144 * fVar88;
  auVar14._0_4_ = fVar87 * fVar86;
  auVar14._8_4_ = fVar87 * fVar121;
  auVar14._12_4_ = fVar144 * fVar85;
  auVar14._16_4_ = fVar87 * 0.0;
  auVar14._20_4_ = fVar144 * 0.0;
  auVar14._24_4_ = fVar87 * 0.0;
  auVar14._28_4_ = uVar63;
  auVar91 = vfmadd231ps_fma(auVar14,auVar81,auVar267);
  auVar15._4_4_ = fVar222 * fVar88;
  auVar15._0_4_ = fVar222 * fVar86;
  auVar15._8_4_ = fVar222 * fVar121;
  auVar15._12_4_ = fVar222 * fVar85;
  auVar15._16_4_ = fVar222 * 0.0;
  auVar15._20_4_ = fVar222 * 0.0;
  auVar15._24_4_ = fVar222 * 0.0;
  auVar15._28_4_ = auVar7._4_4_;
  auVar133 = vfmadd231ps_fma(auVar15,auVar81,auVar253);
  fVar87 = auVar278._0_4_;
  fVar144 = auVar278._4_4_;
  auVar9._4_4_ = fVar144 * fVar88;
  auVar9._0_4_ = fVar87 * fVar86;
  auVar9._8_4_ = fVar87 * fVar121;
  auVar9._12_4_ = fVar144 * fVar85;
  auVar9._16_4_ = fVar87 * 0.0;
  auVar9._20_4_ = fVar144 * 0.0;
  auVar9._24_4_ = fVar87 * 0.0;
  auVar9._28_4_ = fVar257;
  auVar124 = vfmadd231ps_fma(auVar9,auVar81,auVar106);
  auVar7 = vshufps_avx(auVar92,auVar92,0xaa);
  local_548._8_8_ = auVar7._0_8_;
  local_548._0_8_ = local_548._8_8_;
  local_548._16_8_ = local_548._8_8_;
  local_548._24_8_ = local_548._8_8_;
  auVar8 = vshufps_avx(auVar92,auVar92,0xff);
  uStack_620 = auVar8._0_8_;
  local_628 = (undefined1  [8])uStack_620;
  uStack_618 = uStack_620;
  uStack_610 = uStack_620;
  auVar16._4_4_ = fVar64 * fVar88;
  auVar16._0_4_ = fVar64 * fVar86;
  auVar16._8_4_ = fVar64 * fVar121;
  auVar16._12_4_ = fVar64 * fVar85;
  auVar16._16_4_ = fVar64 * 0.0;
  auVar16._20_4_ = fVar64 * 0.0;
  auVar16._24_4_ = fVar64 * 0.0;
  auVar16._28_4_ = fVar64;
  auVar92 = vfmadd231ps_fma(auVar16,auVar81,auVar186);
  auVar8 = vshufps_avx(auVar248,auVar248,0xaa);
  auVar187._0_8_ = auVar8._0_8_;
  auVar187._8_8_ = auVar187._0_8_;
  auVar187._16_8_ = auVar187._0_8_;
  auVar187._24_8_ = auVar187._0_8_;
  auVar278 = vshufps_avx(auVar248,auVar248,0xff);
  local_4e8._8_8_ = auVar278._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar87 = auVar109._0_4_;
  fVar144 = auVar109._4_4_;
  auVar17._4_4_ = fVar144 * fVar88;
  auVar17._0_4_ = fVar87 * fVar86;
  auVar17._8_4_ = fVar87 * fVar121;
  auVar17._12_4_ = fVar144 * fVar85;
  auVar17._16_4_ = fVar87 * 0.0;
  auVar17._20_4_ = fVar144 * 0.0;
  auVar17._24_4_ = fVar87 * 0.0;
  auVar17._28_4_ = auVar7._4_4_;
  auVar145 = vfmadd231ps_fma(auVar17,auVar81,auVar204);
  auVar255._28_4_ = fVar144;
  auVar255._0_28_ =
       ZEXT1628(CONCAT412(auVar133._12_4_ * fVar85,
                          CONCAT48(auVar133._8_4_ * fVar121,
                                   CONCAT44(auVar133._4_4_ * fVar88,auVar133._0_4_ * fVar86))));
  auVar238 = vfmadd231ps_fma(auVar255,auVar81,ZEXT1632(auVar238));
  fVar87 = auVar278._4_4_;
  auVar19._28_4_ = fVar87;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar124._12_4_ * fVar85,
                          CONCAT48(auVar124._8_4_ * fVar121,
                                   CONCAT44(auVar124._4_4_ * fVar88,auVar124._0_4_ * fVar86))));
  auVar91 = vfmadd231ps_fma(auVar19,auVar81,ZEXT1632(auVar91));
  auVar7 = vshufps_avx(auVar73,auVar73,0xaa);
  uVar90 = auVar7._0_8_;
  auVar175._8_8_ = uVar90;
  auVar175._0_8_ = uVar90;
  auVar175._16_8_ = uVar90;
  auVar175._24_8_ = uVar90;
  auVar109 = vshufps_avx(auVar73,auVar73,0xff);
  uVar90 = auVar109._0_8_;
  auVar282._8_8_ = uVar90;
  auVar282._0_8_ = uVar90;
  auVar282._16_8_ = uVar90;
  auVar282._24_8_ = uVar90;
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * fVar85,
                                               CONCAT48(auVar92._8_4_ * fVar121,
                                                        CONCAT44(auVar92._4_4_ * fVar88,
                                                                 auVar92._0_4_ * fVar86)))),auVar81,
                            ZEXT1632(auVar133));
  auVar92 = vshufps_avx(auVar134,auVar134,0xaa);
  auVar248 = vshufps_avx(auVar134,auVar134,0xff);
  auVar134 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar145._12_4_,
                                                CONCAT48(fVar121 * auVar145._8_4_,
                                                         CONCAT44(fVar88 * auVar145._4_4_,
                                                                  fVar86 * auVar145._0_4_)))),
                             auVar81,ZEXT1632(auVar124));
  auVar133 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar73._12_4_,
                                                CONCAT48(fVar121 * auVar73._8_4_,
                                                         CONCAT44(fVar88 * auVar73._4_4_,
                                                                  fVar86 * auVar73._0_4_)))),auVar81
                             ,ZEXT1632(auVar238));
  auVar13 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar238));
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar134._12_4_,
                                               CONCAT48(fVar121 * auVar134._8_4_,
                                                        CONCAT44(fVar88 * auVar134._4_4_,
                                                                 fVar86 * auVar134._0_4_)))),auVar81
                            ,ZEXT1632(auVar91));
  auVar14 = vsubps_avx(ZEXT1632(auVar134),ZEXT1632(auVar91));
  fStack_41c = auVar14._28_4_;
  auVar254._0_4_ = fStack_e0 * auVar13._0_4_ * 3.0;
  auVar254._4_4_ = fStack_e0 * auVar13._4_4_ * 3.0;
  auVar254._8_4_ = fStack_e0 * auVar13._8_4_ * 3.0;
  auVar254._12_4_ = fStack_e0 * auVar13._12_4_ * 3.0;
  auVar254._16_4_ = fStack_e0 * auVar13._16_4_ * 3.0;
  auVar254._20_4_ = fStack_e0 * auVar13._20_4_ * 3.0;
  auVar254._24_4_ = fStack_e0 * auVar13._24_4_ * 3.0;
  auVar254._28_4_ = 0;
  local_438._0_4_ = fStack_e0 * auVar14._0_4_ * 3.0;
  local_438._4_4_ = fStack_e0 * auVar14._4_4_ * 3.0;
  fStack_430 = fStack_e0 * auVar14._8_4_ * 3.0;
  fStack_42c = fStack_e0 * auVar14._12_4_ * 3.0;
  fStack_428 = fStack_e0 * auVar14._16_4_ * 3.0;
  fStack_424 = fStack_e0 * auVar14._20_4_ * 3.0;
  fStack_420 = fStack_e0 * auVar14._24_4_ * 3.0;
  fVar144 = auVar8._0_4_;
  fVar64 = auVar8._4_4_;
  auVar20._4_4_ = fVar64 * fVar88;
  auVar20._0_4_ = fVar144 * fVar86;
  auVar20._8_4_ = fVar144 * fVar121;
  auVar20._12_4_ = fVar64 * fVar85;
  auVar20._16_4_ = fVar144 * 0.0;
  auVar20._20_4_ = fVar64 * 0.0;
  auVar20._24_4_ = fVar144 * 0.0;
  auVar20._28_4_ = fStack_41c;
  auVar8 = vfmadd231ps_fma(auVar20,auVar81,local_548);
  fVar144 = auVar278._0_4_;
  auVar21._4_4_ = fVar87 * fVar88;
  auVar21._0_4_ = fVar144 * fVar86;
  auVar21._8_4_ = fVar144 * fVar121;
  auVar21._12_4_ = fVar87 * fVar85;
  auVar21._16_4_ = fVar144 * 0.0;
  auVar21._20_4_ = fVar87 * 0.0;
  auVar21._24_4_ = fVar144 * 0.0;
  auVar21._28_4_ = 0;
  auVar278 = vfmadd231ps_fma(auVar21,auVar81,_local_628);
  fVar87 = auVar7._0_4_;
  fVar144 = auVar7._4_4_;
  auVar22._4_4_ = fVar144 * fVar88;
  auVar22._0_4_ = fVar87 * fVar86;
  auVar22._8_4_ = fVar87 * fVar121;
  auVar22._12_4_ = fVar144 * fVar85;
  auVar22._16_4_ = fVar87 * 0.0;
  auVar22._20_4_ = fVar144 * 0.0;
  auVar22._24_4_ = fVar87 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar7 = vfmadd231ps_fma(auVar22,auVar81,auVar187);
  fVar87 = auVar109._0_4_;
  fVar222 = auVar109._4_4_;
  auVar23._4_4_ = fVar222 * fVar88;
  auVar23._0_4_ = fVar87 * fVar86;
  auVar23._8_4_ = fVar87 * fVar121;
  auVar23._12_4_ = fVar222 * fVar85;
  auVar23._16_4_ = fVar87 * 0.0;
  auVar23._20_4_ = fVar222 * 0.0;
  auVar23._24_4_ = fVar87 * 0.0;
  auVar23._28_4_ = fVar64;
  auVar109 = vfmadd231ps_fma(auVar23,auVar81,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar133));
  fVar87 = auVar92._0_4_;
  fVar144 = auVar92._4_4_;
  auVar24._4_4_ = fVar144 * fVar88;
  auVar24._0_4_ = fVar87 * fVar86;
  auVar24._8_4_ = fVar87 * fVar121;
  auVar24._12_4_ = fVar144 * fVar85;
  auVar24._16_4_ = fVar87 * 0.0;
  auVar24._20_4_ = fVar144 * 0.0;
  auVar24._24_4_ = fVar87 * 0.0;
  auVar24._28_4_ = fVar144;
  auVar92 = vfmadd231ps_fma(auVar24,auVar81,auVar175);
  auVar16 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar73));
  fVar87 = auVar248._0_4_;
  fVar144 = auVar248._4_4_;
  auVar25._4_4_ = fVar144 * fVar88;
  auVar25._0_4_ = fVar87 * fVar86;
  auVar25._8_4_ = fVar87 * fVar121;
  auVar25._12_4_ = fVar144 * fVar85;
  auVar25._16_4_ = fVar87 * 0.0;
  auVar25._20_4_ = fVar144 * 0.0;
  auVar25._24_4_ = fVar87 * 0.0;
  auVar25._28_4_ = fVar144;
  auVar248 = vfmadd231ps_fma(auVar25,auVar81,auVar282);
  auVar26._28_4_ = fVar222;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar7._12_4_ * fVar85,
                          CONCAT48(auVar7._8_4_ * fVar121,
                                   CONCAT44(auVar7._4_4_ * fVar88,auVar7._0_4_ * fVar86))));
  auVar8 = vfmadd231ps_fma(auVar26,auVar81,ZEXT1632(auVar8));
  auVar278 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar109._12_4_,
                                                CONCAT48(fVar121 * auVar109._8_4_,
                                                         CONCAT44(fVar88 * auVar109._4_4_,
                                                                  fVar86 * auVar109._0_4_)))),
                             auVar81,ZEXT1632(auVar278));
  auVar107._0_4_ = auVar133._0_4_ + auVar254._0_4_;
  auVar107._4_4_ = auVar133._4_4_ + auVar254._4_4_;
  auVar107._8_4_ = auVar133._8_4_ + auVar254._8_4_;
  auVar107._12_4_ = auVar133._12_4_ + auVar254._12_4_;
  auVar107._16_4_ = auVar254._16_4_ + 0.0;
  auVar107._20_4_ = auVar254._20_4_ + 0.0;
  auVar107._24_4_ = auVar254._24_4_ + 0.0;
  auVar107._28_4_ = 0;
  auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * fVar85,
                                              CONCAT48(auVar92._8_4_ * fVar121,
                                                       CONCAT44(auVar92._4_4_ * fVar88,
                                                                auVar92._0_4_ * fVar86)))),auVar81,
                           ZEXT1632(auVar7));
  auVar109 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar248._12_4_ * fVar85,
                                                CONCAT48(auVar248._8_4_ * fVar121,
                                                         CONCAT44(auVar248._4_4_ * fVar88,
                                                                  auVar248._0_4_ * fVar86)))),
                             auVar81,ZEXT1632(auVar109));
  auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar7._12_4_,
                                               CONCAT48(fVar121 * auVar7._8_4_,
                                                        CONCAT44(fVar88 * auVar7._4_4_,
                                                                 fVar86 * auVar7._0_4_)))),auVar81,
                            ZEXT1632(auVar8));
  auVar248 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar109._12_4_ * fVar85,
                                                CONCAT48(auVar109._8_4_ * fVar121,
                                                         CONCAT44(auVar109._4_4_ * fVar88,
                                                                  auVar109._0_4_ * fVar86)))),
                             ZEXT1632(auVar278),auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar13 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar278));
  auVar275._0_4_ = fStack_e0 * auVar81._0_4_ * 3.0;
  auVar275._4_4_ = fStack_e0 * auVar81._4_4_ * 3.0;
  auVar275._8_4_ = fStack_e0 * auVar81._8_4_ * 3.0;
  auVar275._12_4_ = fStack_e0 * auVar81._12_4_ * 3.0;
  auVar275._16_4_ = fStack_e0 * auVar81._16_4_ * 3.0;
  auVar275._20_4_ = fStack_e0 * auVar81._20_4_ * 3.0;
  auVar275._24_4_ = fStack_e0 * auVar81._24_4_ * 3.0;
  auVar275._28_4_ = 0;
  local_f8 = fStack_e0 * auVar13._0_4_ * 3.0;
  fStack_f4 = fStack_e0 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_f4;
  auVar27._0_4_ = local_f8;
  fStack_f0 = fStack_e0 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_f0;
  fStack_ec = fStack_e0 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_ec;
  fStack_e8 = fStack_e0 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_e8;
  fStack_e4 = fStack_e0 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_e4;
  fStack_e0 = fStack_e0 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_e0;
  auVar27._28_4_ = 0x40400000;
  _local_418 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar92));
  local_268 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar248));
  auVar81 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar133));
  auVar13 = vsubps_avx(ZEXT1632(auVar248),ZEXT1632(auVar73));
  auVar14 = vsubps_avx(_local_418,local_4e8);
  fVar257 = auVar81._0_4_ + auVar14._0_4_;
  fVar258 = auVar81._4_4_ + auVar14._4_4_;
  fVar189 = auVar81._8_4_ + auVar14._8_4_;
  fVar190 = auVar81._12_4_ + auVar14._12_4_;
  fVar191 = auVar81._16_4_ + auVar14._16_4_;
  fVar192 = auVar81._20_4_ + auVar14._20_4_;
  fVar193 = auVar81._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(local_268,auVar16);
  auVar82._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar82._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar82._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar82._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar82._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar82._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar82._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar82._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_98 = ZEXT1632(auVar73);
  fVar86 = auVar73._0_4_;
  local_118 = (float)local_438._0_4_ + fVar86;
  fVar88 = auVar73._4_4_;
  fStack_114 = (float)local_438._4_4_ + fVar88;
  fVar121 = auVar73._8_4_;
  fStack_110 = fStack_430 + fVar121;
  fVar85 = auVar73._12_4_;
  fStack_10c = fStack_42c + fVar85;
  fStack_108 = fStack_428 + 0.0;
  fStack_104 = fStack_424 + 0.0;
  fStack_100 = fStack_420 + 0.0;
  local_288 = ZEXT1632(auVar133);
  auVar13 = vsubps_avx(local_288,auVar254);
  local_78 = vpermps_avx2(_DAT_01fec480,auVar13);
  auVar13 = vsubps_avx(local_98,_local_438);
  local_138 = vpermps_avx2(_DAT_01fec480,auVar13);
  local_b8._0_4_ = auVar92._0_4_ + auVar275._0_4_;
  local_b8._4_4_ = auVar92._4_4_ + auVar275._4_4_;
  local_b8._8_4_ = auVar92._8_4_ + auVar275._8_4_;
  local_b8._12_4_ = auVar92._12_4_ + auVar275._12_4_;
  local_b8._16_4_ = auVar275._16_4_ + 0.0;
  local_b8._20_4_ = auVar275._20_4_ + 0.0;
  local_b8._24_4_ = auVar275._24_4_ + 0.0;
  local_b8._28_4_ = 0;
  auVar220 = ZEXT3264(local_b8);
  auVar255 = ZEXT1632(auVar92);
  auVar13 = vsubps_avx(auVar255,auVar275);
  auVar17 = vpermps_avx2(_DAT_01fec480,auVar13);
  fVar87 = auVar248._0_4_;
  local_f8 = fVar87 + local_f8;
  fVar144 = auVar248._4_4_;
  fStack_f4 = fVar144 + fStack_f4;
  fVar64 = auVar248._8_4_;
  fStack_f0 = fVar64 + fStack_f0;
  fVar222 = auVar248._12_4_;
  fStack_ec = fVar222 + fStack_ec;
  fStack_e8 = fStack_e8 + 0.0;
  fStack_e4 = fStack_e4 + 0.0;
  fStack_e0 = fStack_e0 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar248),auVar27);
  local_d8 = vpermps_avx2(_DAT_01fec480,auVar13);
  auVar28._4_4_ = fVar88 * fVar258;
  auVar28._0_4_ = fVar86 * fVar257;
  auVar28._8_4_ = fVar121 * fVar189;
  auVar28._12_4_ = fVar85 * fVar190;
  auVar28._16_4_ = fVar191 * 0.0;
  auVar28._20_4_ = fVar192 * 0.0;
  auVar28._24_4_ = fVar193 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar7 = vfnmadd231ps_fma(auVar28,local_288,auVar82);
  fStack_fc = fStack_41c + 0.0;
  auVar29._4_4_ = fStack_114 * fVar258;
  auVar29._0_4_ = local_118 * fVar257;
  auVar29._8_4_ = fStack_110 * fVar189;
  auVar29._12_4_ = fStack_10c * fVar190;
  auVar29._16_4_ = fStack_108 * fVar191;
  auVar29._20_4_ = fStack_104 * fVar192;
  auVar29._24_4_ = fStack_100 * fVar193;
  auVar29._28_4_ = 0;
  auVar8 = vfnmadd231ps_fma(auVar29,auVar82,auVar107);
  auVar30._4_4_ = local_138._4_4_ * fVar258;
  auVar30._0_4_ = local_138._0_4_ * fVar257;
  auVar30._8_4_ = local_138._8_4_ * fVar189;
  auVar30._12_4_ = local_138._12_4_ * fVar190;
  auVar30._16_4_ = local_138._16_4_ * fVar191;
  auVar30._20_4_ = local_138._20_4_ * fVar192;
  auVar30._24_4_ = local_138._24_4_ * fVar193;
  auVar30._28_4_ = fStack_41c + 0.0;
  auVar278 = vfnmadd231ps_fma(auVar30,local_78,auVar82);
  local_628._0_4_ = auVar16._0_4_;
  local_628._4_4_ = auVar16._4_4_;
  uStack_620._0_4_ = auVar16._8_4_;
  uStack_620._4_4_ = auVar16._12_4_;
  uStack_618._0_4_ = auVar16._16_4_;
  uStack_618._4_4_ = auVar16._20_4_;
  uStack_610._0_4_ = auVar16._24_4_;
  uStack_610._4_4_ = auVar16._28_4_;
  auVar31._4_4_ = (float)local_628._4_4_ * fVar258;
  auVar31._0_4_ = (float)local_628._0_4_ * fVar257;
  auVar31._8_4_ = (float)uStack_620 * fVar189;
  auVar31._12_4_ = uStack_620._4_4_ * fVar190;
  auVar31._16_4_ = (float)uStack_618 * fVar191;
  auVar31._20_4_ = uStack_618._4_4_ * fVar192;
  auVar31._24_4_ = (float)uStack_610 * fVar193;
  auVar31._28_4_ = uStack_610._4_4_;
  auVar109 = vfnmadd231ps_fma(auVar31,local_4e8,auVar82);
  auVar205._0_4_ = fVar87 * fVar257;
  auVar205._4_4_ = fVar144 * fVar258;
  auVar205._8_4_ = fVar64 * fVar189;
  auVar205._12_4_ = fVar222 * fVar190;
  auVar205._16_4_ = fVar191 * 0.0;
  auVar205._20_4_ = fVar192 * 0.0;
  auVar205._24_4_ = fVar193 * 0.0;
  auVar205._28_4_ = 0;
  auVar92 = vfnmadd231ps_fma(auVar205,auVar255,auVar82);
  uStack_dc = 0x40400000;
  auVar32._4_4_ = fStack_f4 * fVar258;
  auVar32._0_4_ = local_f8 * fVar257;
  auVar32._8_4_ = fStack_f0 * fVar189;
  auVar32._12_4_ = fStack_ec * fVar190;
  auVar32._16_4_ = fStack_e8 * fVar191;
  auVar32._20_4_ = fStack_e4 * fVar192;
  auVar32._24_4_ = fStack_e0 * fVar193;
  auVar32._28_4_ = local_4e8._28_4_;
  auVar73 = vfnmadd231ps_fma(auVar32,local_b8,auVar82);
  auVar33._4_4_ = local_d8._4_4_ * fVar258;
  auVar33._0_4_ = local_d8._0_4_ * fVar257;
  auVar33._8_4_ = local_d8._8_4_ * fVar189;
  auVar33._12_4_ = local_d8._12_4_ * fVar190;
  auVar33._16_4_ = local_d8._16_4_ * fVar191;
  auVar33._20_4_ = local_d8._20_4_ * fVar192;
  auVar33._24_4_ = local_d8._24_4_ * fVar193;
  auVar33._28_4_ = local_d8._28_4_;
  auVar134 = vfnmadd231ps_fma(auVar33,auVar17,auVar82);
  auVar34._4_4_ = local_268._4_4_ * fVar258;
  auVar34._0_4_ = local_268._0_4_ * fVar257;
  auVar34._8_4_ = local_268._8_4_ * fVar189;
  auVar34._12_4_ = local_268._12_4_ * fVar190;
  auVar34._16_4_ = local_268._16_4_ * fVar191;
  auVar34._20_4_ = local_268._20_4_ * fVar192;
  auVar34._24_4_ = local_268._24_4_ * fVar193;
  auVar34._28_4_ = auVar81._28_4_ + auVar14._28_4_;
  auVar238 = vfnmadd231ps_fma(auVar34,_local_418,auVar82);
  auVar13 = vminps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar81 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar14 = vminps_avx(ZEXT1632(auVar278),ZEXT1632(auVar109));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar278),ZEXT1632(auVar109));
  auVar81 = vmaxps_avx(auVar81,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar92),ZEXT1632(auVar73));
  auVar13 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar73));
  auVar9 = vminps_avx(ZEXT1632(auVar134),ZEXT1632(auVar238));
  auVar15 = vminps_avx(auVar15,auVar9);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar134),ZEXT1632(auVar238));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar81,auVar13);
  auVar47._4_4_ = fStack_224;
  auVar47._0_4_ = local_228;
  auVar47._8_4_ = fStack_220;
  auVar47._12_4_ = fStack_21c;
  auVar47._16_4_ = fStack_218;
  auVar47._20_4_ = fStack_214;
  auVar47._24_4_ = fStack_210;
  auVar47._28_4_ = fStack_20c;
  auVar81 = vcmpps_avx(auVar15,auVar47,2);
  auVar45._4_4_ = fStack_244;
  auVar45._0_4_ = local_248;
  auVar45._8_4_ = fStack_240;
  auVar45._12_4_ = fStack_23c;
  auVar45._16_4_ = fStack_238;
  auVar45._20_4_ = fStack_234;
  auVar45._24_4_ = fStack_230;
  auVar45._28_4_ = fStack_22c;
  auVar13 = vcmpps_avx(auVar13,auVar45,5);
  auVar81 = vandps_avx(auVar13,auVar81);
  auVar13 = local_158 & auVar81;
  _local_438 = auVar17;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_4e8,local_288);
    auVar14 = vsubps_avx(_local_418,auVar255);
    fVar258 = auVar13._0_4_ + auVar14._0_4_;
    fVar189 = auVar13._4_4_ + auVar14._4_4_;
    fVar190 = auVar13._8_4_ + auVar14._8_4_;
    fVar191 = auVar13._12_4_ + auVar14._12_4_;
    fVar192 = auVar13._16_4_ + auVar14._16_4_;
    fVar193 = auVar13._20_4_ + auVar14._20_4_;
    fVar89 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(auVar16,local_98);
    auVar9 = vsubps_avx(local_268,ZEXT1632(auVar248));
    auVar108._0_4_ = auVar15._0_4_ + auVar9._0_4_;
    auVar108._4_4_ = auVar15._4_4_ + auVar9._4_4_;
    auVar108._8_4_ = auVar15._8_4_ + auVar9._8_4_;
    auVar108._12_4_ = auVar15._12_4_ + auVar9._12_4_;
    auVar108._16_4_ = auVar15._16_4_ + auVar9._16_4_;
    auVar108._20_4_ = auVar15._20_4_ + auVar9._20_4_;
    auVar108._24_4_ = auVar15._24_4_ + auVar9._24_4_;
    fVar257 = auVar9._28_4_;
    auVar108._28_4_ = auVar15._28_4_ + fVar257;
    auVar35._4_4_ = fVar88 * fVar189;
    auVar35._0_4_ = fVar86 * fVar258;
    auVar35._8_4_ = fVar121 * fVar190;
    auVar35._12_4_ = fVar85 * fVar191;
    auVar35._16_4_ = fVar192 * 0.0;
    auVar35._20_4_ = fVar193 * 0.0;
    auVar35._24_4_ = fVar89 * 0.0;
    auVar35._28_4_ = local_418._28_4_;
    auVar92 = vfnmadd231ps_fma(auVar35,auVar108,local_288);
    auVar36._4_4_ = fVar189 * fStack_114;
    auVar36._0_4_ = fVar258 * local_118;
    auVar36._8_4_ = fVar190 * fStack_110;
    auVar36._12_4_ = fVar191 * fStack_10c;
    auVar36._16_4_ = fVar192 * fStack_108;
    auVar36._20_4_ = fVar193 * fStack_104;
    auVar36._24_4_ = fVar89 * fStack_100;
    auVar36._28_4_ = 0;
    auVar7 = vfnmadd213ps_fma(auVar107,auVar108,auVar36);
    auVar37._4_4_ = fVar189 * local_138._4_4_;
    auVar37._0_4_ = fVar258 * local_138._0_4_;
    auVar37._8_4_ = fVar190 * local_138._8_4_;
    auVar37._12_4_ = fVar191 * local_138._12_4_;
    auVar37._16_4_ = fVar192 * local_138._16_4_;
    auVar37._20_4_ = fVar193 * local_138._20_4_;
    auVar37._24_4_ = fVar89 * local_138._24_4_;
    auVar37._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(local_78,auVar108,auVar37);
    auVar38._4_4_ = (float)local_628._4_4_ * fVar189;
    auVar38._0_4_ = (float)local_628._0_4_ * fVar258;
    auVar38._8_4_ = (float)uStack_620 * fVar190;
    auVar38._12_4_ = uStack_620._4_4_ * fVar191;
    auVar38._16_4_ = (float)uStack_618 * fVar192;
    auVar38._20_4_ = uStack_618._4_4_ * fVar193;
    auVar38._24_4_ = (float)uStack_610 * fVar89;
    auVar38._28_4_ = 0;
    auVar248 = vfnmadd231ps_fma(auVar38,auVar108,local_4e8);
    auVar130._0_4_ = fVar87 * fVar258;
    auVar130._4_4_ = fVar144 * fVar189;
    auVar130._8_4_ = fVar64 * fVar190;
    auVar130._12_4_ = fVar222 * fVar191;
    auVar130._16_4_ = fVar192 * 0.0;
    auVar130._20_4_ = fVar193 * 0.0;
    auVar130._24_4_ = fVar89 * 0.0;
    auVar130._28_4_ = 0;
    auVar73 = vfnmadd231ps_fma(auVar130,auVar108,auVar255);
    auVar39._4_4_ = fVar189 * fStack_f4;
    auVar39._0_4_ = fVar258 * local_f8;
    auVar39._8_4_ = fVar190 * fStack_f0;
    auVar39._12_4_ = fVar191 * fStack_ec;
    auVar39._16_4_ = fVar192 * fStack_e8;
    auVar39._20_4_ = fVar193 * fStack_e4;
    auVar39._24_4_ = fVar89 * fStack_e0;
    auVar39._28_4_ = fVar257;
    auVar278 = vfnmadd213ps_fma(local_b8,auVar108,auVar39);
    auVar40._4_4_ = fVar189 * local_d8._4_4_;
    auVar40._0_4_ = fVar258 * local_d8._0_4_;
    auVar40._8_4_ = fVar190 * local_d8._8_4_;
    auVar40._12_4_ = fVar191 * local_d8._12_4_;
    auVar40._16_4_ = fVar192 * local_d8._16_4_;
    auVar40._20_4_ = fVar193 * local_d8._20_4_;
    auVar40._24_4_ = fVar89 * local_d8._24_4_;
    auVar40._28_4_ = fVar257;
    auVar109 = vfnmadd213ps_fma(auVar17,auVar108,auVar40);
    auVar220 = ZEXT1664(auVar109);
    auVar41._4_4_ = local_268._4_4_ * fVar189;
    auVar41._0_4_ = local_268._0_4_ * fVar258;
    auVar41._8_4_ = local_268._8_4_ * fVar190;
    auVar41._12_4_ = local_268._12_4_ * fVar191;
    auVar41._16_4_ = local_268._16_4_ * fVar192;
    auVar41._20_4_ = local_268._20_4_ * fVar193;
    auVar41._24_4_ = local_268._24_4_ * fVar89;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar134 = vfnmadd231ps_fma(auVar41,_local_418,auVar108);
    auVar14 = vminps_avx(ZEXT1632(auVar92),ZEXT1632(auVar7));
    auVar13 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar7));
    auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar248));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar248));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar9 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar278));
    auVar14 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar278));
    auVar16 = vminps_avx(ZEXT1632(auVar109),ZEXT1632(auVar134));
    auVar9 = vminps_avx(auVar9,auVar16);
    auVar9 = vminps_avx(auVar15,auVar9);
    auVar15 = vmaxps_avx(ZEXT1632(auVar109),ZEXT1632(auVar134));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar48._4_4_ = fStack_224;
    auVar48._0_4_ = local_228;
    auVar48._8_4_ = fStack_220;
    auVar48._12_4_ = fStack_21c;
    auVar48._16_4_ = fStack_218;
    auVar48._20_4_ = fStack_214;
    auVar48._24_4_ = fStack_210;
    auVar48._28_4_ = fStack_20c;
    auVar13 = vcmpps_avx(auVar9,auVar48,2);
    auVar46._4_4_ = fStack_244;
    auVar46._0_4_ = local_248;
    auVar46._8_4_ = fStack_240;
    auVar46._12_4_ = fStack_23c;
    auVar46._16_4_ = fStack_238;
    auVar46._20_4_ = fStack_234;
    auVar46._24_4_ = fStack_230;
    auVar46._28_4_ = fStack_22c;
    auVar14 = vcmpps_avx(auVar14,auVar46,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar81 = vandps_avx(local_158,auVar81);
    auVar14 = auVar81 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar13,auVar81);
      uVar57 = vmovmskps_avx(auVar81);
      if (uVar57 != 0) {
        auStack_3e8[uVar52] = uVar57 & 0xff;
        uVar90 = vmovlps_avx(local_338);
        *(undefined8 *)(&uStack_208 + uVar52 * 2) = uVar90;
        uVar58 = vmovlps_avx(auVar68);
        auStack_58[uVar52] = uVar58;
        uVar52 = (ulong)((int)uVar52 + 1);
      }
    }
  }
LAB_015aa16f:
  if ((int)uVar52 != 0) {
    uVar51 = (int)uVar52 - 1;
    uVar53 = (ulong)uVar51;
    uVar56 = auStack_3e8[uVar53];
    uVar57 = (&uStack_208)[uVar53 * 2];
    fVar86 = afStack_204[uVar53 * 2];
    iVar18 = 0;
    for (uVar58 = (ulong)uVar56; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      iVar18 = iVar18 + 1;
    }
    uVar56 = uVar56 - 1 & uVar56;
    if (uVar56 == 0) {
      uVar52 = (ulong)uVar51;
    }
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_58[uVar53];
    auStack_3e8[uVar53] = uVar56;
    fVar88 = (float)(iVar18 + 1) * 0.14285715;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * (float)iVar18 * 0.14285715)),ZEXT416(uVar57),
                             ZEXT416((uint)(1.0 - (float)iVar18 * 0.14285715)));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * fVar88)),ZEXT416(uVar57),
                             ZEXT416((uint)(1.0 - fVar88)));
    fVar88 = auVar8._0_4_;
    auVar188._0_4_ = auVar7._0_4_;
    fVar86 = fVar88 - auVar188._0_4_;
    if (fVar86 < 0.16666667) {
      auVar278 = vshufps_avx(auVar68,auVar68,0x50);
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = 0x3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar109 = vsubps_avx(auVar97,auVar278);
      fVar121 = auVar278._0_4_;
      auVar137._0_4_ = fVar121 * fVar132;
      fVar85 = auVar278._4_4_;
      auVar137._4_4_ = fVar85 * fVar143;
      fVar87 = auVar278._8_4_;
      auVar137._8_4_ = fVar87 * fVar132;
      fVar144 = auVar278._12_4_;
      auVar137._12_4_ = fVar144 * fVar143;
      auVar150._0_4_ = fVar121 * fVar243;
      auVar150._4_4_ = fVar85 * fVar256;
      auVar150._8_4_ = fVar87 * fVar243;
      auVar150._12_4_ = fVar144 * fVar256;
      auVar172._0_4_ = fVar121 * fVar194;
      auVar172._4_4_ = fVar85 * fVar206;
      auVar172._8_4_ = fVar87 * fVar194;
      auVar172._12_4_ = fVar144 * fVar206;
      auVar70._0_4_ = fVar121 * fVar207;
      auVar70._4_4_ = fVar85 * fVar221;
      auVar70._8_4_ = fVar87 * fVar207;
      auVar70._12_4_ = fVar144 * fVar221;
      auVar278 = vfmadd231ps_fma(auVar137,auVar109,auVar182);
      auVar92 = vfmadd231ps_fma(auVar150,auVar109,auVar227);
      auVar248 = vfmadd231ps_fma(auVar172,auVar109,auVar247);
      auVar109 = vfmadd231ps_fma(auVar70,auVar109,auVar261);
      auVar131._16_16_ = auVar278;
      auVar131._0_16_ = auVar278;
      auVar142._16_16_ = auVar92;
      auVar142._0_16_ = auVar92;
      auVar158._16_16_ = auVar248;
      auVar158._0_16_ = auVar248;
      auVar188._4_4_ = auVar188._0_4_;
      auVar188._8_4_ = auVar188._0_4_;
      auVar188._12_4_ = auVar188._0_4_;
      auVar188._20_4_ = fVar88;
      auVar188._16_4_ = fVar88;
      auVar188._24_4_ = fVar88;
      auVar188._28_4_ = fVar88;
      auVar81 = vsubps_avx(auVar142,auVar131);
      auVar92 = vfmadd213ps_fma(auVar81,auVar188,auVar131);
      auVar81 = vsubps_avx(auVar158,auVar142);
      auVar73 = vfmadd213ps_fma(auVar81,auVar188,auVar142);
      auVar278 = vsubps_avx(auVar109,auVar248);
      auVar83._16_16_ = auVar278;
      auVar83._0_16_ = auVar278;
      auVar278 = vfmadd213ps_fma(auVar83,auVar188,auVar158);
      auVar81 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar92));
      auVar109 = vfmadd213ps_fma(auVar81,auVar188,ZEXT1632(auVar92));
      auVar81 = vsubps_avx(ZEXT1632(auVar278),ZEXT1632(auVar73));
      auVar278 = vfmadd213ps_fma(auVar81,auVar188,ZEXT1632(auVar73));
      auVar81 = vsubps_avx(ZEXT1632(auVar278),ZEXT1632(auVar109));
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar81,auVar188);
      fVar222 = auVar81._4_4_ * 3.0;
      local_4e8._0_4_ = fVar86;
      fVar121 = fVar86 * 0.33333334;
      local_268._0_8_ =
           CONCAT44(auVar91._4_4_ + fVar121 * fVar222,auVar91._0_4_ + fVar121 * auVar81._0_4_ * 3.0)
      ;
      local_268._8_4_ = auVar91._8_4_ + fVar121 * auVar81._8_4_ * 3.0;
      local_268._12_4_ = auVar91._12_4_ + fVar121 * auVar81._12_4_ * 3.0;
      auVar109 = vshufpd_avx(auVar91,auVar91,3);
      auVar92 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_438 = auVar109;
      auVar278 = vsubps_avx(auVar109,auVar91);
      _local_418 = auVar92;
      auVar248 = vsubps_avx(auVar92,(undefined1  [16])0x0);
      auVar71._0_4_ = auVar278._0_4_ + auVar248._0_4_;
      auVar71._4_4_ = auVar278._4_4_ + auVar248._4_4_;
      auVar71._8_4_ = auVar278._8_4_ + auVar248._8_4_;
      auVar71._12_4_ = auVar278._12_4_ + auVar248._12_4_;
      auVar278 = vshufps_avx(auVar91,auVar91,0xb1);
      auVar248 = vshufps_avx(local_268._0_16_,local_268._0_16_,0xb1);
      auVar271._4_4_ = auVar71._0_4_;
      auVar271._0_4_ = auVar71._0_4_;
      auVar271._8_4_ = auVar71._0_4_;
      auVar271._12_4_ = auVar71._0_4_;
      auVar73 = vshufps_avx(auVar71,auVar71,0x55);
      fVar85 = auVar73._0_4_;
      auVar72._0_4_ = fVar85 * auVar278._0_4_;
      fVar87 = auVar73._4_4_;
      auVar72._4_4_ = fVar87 * auVar278._4_4_;
      fVar144 = auVar73._8_4_;
      auVar72._8_4_ = fVar144 * auVar278._8_4_;
      fVar64 = auVar73._12_4_;
      auVar72._12_4_ = fVar64 * auVar278._12_4_;
      auVar151._0_4_ = fVar85 * auVar248._0_4_;
      auVar151._4_4_ = fVar87 * auVar248._4_4_;
      auVar151._8_4_ = fVar144 * auVar248._8_4_;
      auVar151._12_4_ = fVar64 * auVar248._12_4_;
      auVar134 = vfmadd231ps_fma(auVar72,auVar271,auVar91);
      auVar238 = vfmadd231ps_fma(auVar151,auVar271,local_268._0_16_);
      auVar248 = vshufps_avx(auVar134,auVar134,0xe8);
      auVar73 = vshufps_avx(auVar238,auVar238,0xe8);
      auVar278 = vcmpps_avx(auVar248,auVar73,1);
      uVar57 = vextractps_avx(auVar278,0);
      auVar133 = auVar238;
      if ((uVar57 & 1) == 0) {
        auVar133 = auVar134;
      }
      auVar123._0_4_ = fVar121 * auVar81._16_4_ * 3.0;
      auVar123._4_4_ = fVar121 * fVar222;
      auVar123._8_4_ = fVar121 * auVar81._24_4_ * 3.0;
      auVar123._12_4_ = fVar121 * auVar220._28_4_;
      local_288._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar123);
      auVar124 = vshufps_avx(local_288._0_16_,local_288._0_16_,0xb1);
      auVar145 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar183._0_4_ = fVar85 * auVar124._0_4_;
      auVar183._4_4_ = fVar87 * auVar124._4_4_;
      auVar183._8_4_ = fVar144 * auVar124._8_4_;
      auVar183._12_4_ = fVar64 * auVar124._12_4_;
      auVar199._0_4_ = auVar145._0_4_ * fVar85;
      auVar199._4_4_ = auVar145._4_4_ * fVar87;
      auVar199._8_4_ = auVar145._8_4_ * fVar144;
      auVar199._12_4_ = auVar145._12_4_ * fVar64;
      auVar179 = vfmadd231ps_fma(auVar183,auVar271,local_288._0_16_);
      auVar195 = vfmadd231ps_fma(auVar199,(undefined1  [16])0x0,auVar271);
      auVar145 = vshufps_avx(auVar179,auVar179,0xe8);
      auVar146 = vshufps_avx(auVar195,auVar195,0xe8);
      auVar220 = ZEXT1664(auVar146);
      auVar124 = vcmpps_avx(auVar145,auVar146,1);
      uVar57 = vextractps_avx(auVar124,0);
      auVar196 = auVar195;
      if ((uVar57 & 1) == 0) {
        auVar196 = auVar179;
      }
      auVar133 = vmaxss_avx(auVar196,auVar133);
      auVar248 = vminps_avx(auVar248,auVar73);
      auVar73 = vminps_avx(auVar145,auVar146);
      auVar73 = vminps_avx(auVar248,auVar73);
      auVar278 = vshufps_avx(auVar278,auVar278,0x55);
      auVar278 = vblendps_avx(auVar278,auVar124,2);
      auVar124 = vpslld_avx(auVar278,0x1f);
      auVar278 = vshufpd_avx(auVar238,auVar238,1);
      auVar278 = vinsertps_avx(auVar278,auVar195,0x9c);
      auVar248 = vshufpd_avx(auVar134,auVar134,1);
      auVar248 = vinsertps_avx(auVar248,auVar179,0x9c);
      auVar278 = vblendvps_avx(auVar248,auVar278,auVar124);
      auVar248 = vmovshdup_avx(auVar278);
      auVar278 = vmaxss_avx(auVar248,auVar278);
      fVar144 = auVar73._0_4_;
      auVar248 = vmovshdup_avx(auVar73);
      fVar87 = auVar278._0_4_;
      fVar121 = auVar248._0_4_;
      fVar85 = auVar133._0_4_;
      if (((0.0001 <= fVar144) || (fVar87 <= -0.0001)) && (0.0001 <= fVar121 || fVar87 <= -0.0001))
      goto code_r0x015aa484;
      goto LAB_015aa4ab;
    }
    local_338 = vinsertps_avx(auVar7,auVar8,0x10);
    goto LAB_015a9bbb;
  }
  if (bVar59 != false) {
    return bVar59;
  }
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar80._4_4_ = uVar63;
  auVar80._0_4_ = uVar63;
  auVar80._8_4_ = uVar63;
  auVar80._12_4_ = uVar63;
  auVar7 = vcmpps_avx(local_348,auVar80,2);
  uVar50 = vmovmskps_avx(auVar7);
  uVar50 = (uint)uVar60 & uVar50;
  context = pRVar49;
  if (uVar50 == 0) {
    return false;
  }
  goto LAB_015a9426;
code_r0x015aa484:
  auVar248 = vcmpps_avx(auVar248,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar134 = vcmpps_avx(auVar73,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar248 = vandps_avx(auVar134,auVar248);
  if (fVar85 <= -0.0001 || (auVar248 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_015aa16f;
LAB_015aa4ab:
  auVar134 = vcmpps_avx(auVar73,_DAT_01f7aa10,1);
  auVar238 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar248 = vcmpss_avx(auVar133,ZEXT816(0) << 0x20,1);
  auVar112._8_4_ = 0xbf800000;
  auVar112._0_8_ = 0xbf800000bf800000;
  auVar112._12_4_ = 0xbf800000;
  auVar248 = vblendvps_avx(auVar97,auVar112,auVar248);
  auVar134 = vblendvps_avx(auVar97,auVar112,auVar134);
  fVar222 = auVar134._0_4_;
  fVar64 = auVar248._0_4_;
  auVar248 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar222 == fVar64) && (!NAN(fVar222) && !NAN(fVar64))) {
    auVar248 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar222 == fVar64) && (!NAN(fVar222) && !NAN(fVar64))) {
    auVar238 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar134 = vmovshdup_avx(auVar134);
  fVar257 = auVar134._0_4_;
  if ((fVar222 != fVar257) || (NAN(fVar222) || NAN(fVar257))) {
    auVar184._12_4_ = 0;
    auVar184._0_12_ = ZEXT812(0);
    auVar184 = auVar184 << 0x20;
    if ((fVar121 != fVar144) || (NAN(fVar121) || NAN(fVar144))) {
      auVar125._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
      auVar125._8_4_ = auVar73._8_4_ ^ 0x80000000;
      auVar125._12_4_ = auVar73._12_4_ ^ 0x80000000;
      auVar126._0_4_ = -fVar144 / (fVar121 - fVar144);
      auVar126._4_12_ = auVar125._4_12_;
      auVar73 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar184,auVar126);
      auVar134 = auVar73;
    }
    else {
      auVar73 = ZEXT816(0) << 0x20;
      if ((fVar144 != 0.0) || (auVar134 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar144))) {
        auVar73 = SUB6416(ZEXT464(0x7f800000),0);
        auVar134 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar248 = vminss_avx(auVar248,auVar73);
    auVar238 = vmaxss_avx(auVar134,auVar238);
  }
  else {
    auVar42._12_4_ = 0;
    auVar42._0_12_ = ZEXT812(0);
    auVar184 = auVar42 << 0x20;
  }
  auVar278 = vcmpss_avx(auVar278,auVar184,1);
  auVar113._8_4_ = 0xbf800000;
  auVar113._0_8_ = 0xbf800000bf800000;
  auVar113._12_4_ = 0xbf800000;
  auVar278 = vblendvps_avx(auVar97,auVar113,auVar278);
  fVar121 = auVar278._0_4_;
  auVar278 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar64 != fVar121) || (NAN(fVar64) || NAN(fVar121))) {
    if ((fVar87 != fVar85) || (NAN(fVar87) || NAN(fVar85))) {
      auVar74._0_8_ = auVar133._0_8_ ^ 0x8000000080000000;
      auVar74._8_4_ = auVar133._8_4_ ^ 0x80000000;
      auVar74._12_4_ = auVar133._12_4_ ^ 0x80000000;
      auVar127._0_4_ = -fVar85 / (fVar87 - fVar85);
      auVar127._4_12_ = auVar74._4_12_;
      auVar73 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar184,auVar127);
      auVar134 = auVar73;
    }
    else {
      auVar73 = ZEXT816(0) << 0x20;
      if ((fVar85 != 0.0) || (auVar134 = auVar278, NAN(fVar85))) {
        auVar73 = SUB6416(ZEXT464(0x7f800000),0);
        auVar134 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar248 = vminss_avx(auVar248,auVar73);
    auVar238 = vmaxss_avx(auVar134,auVar238);
  }
  if ((fVar257 != fVar121) || (NAN(fVar257) || NAN(fVar121))) {
    auVar248 = vminss_avx(auVar248,auVar278);
    auVar238 = vmaxss_avx(auVar278,auVar238);
  }
  auVar248 = vmaxss_avx(auVar184,auVar248);
  auVar73 = vminss_avx(auVar238,auVar278);
  if (auVar73._0_4_ < auVar248._0_4_) goto LAB_015aa16f;
  auVar248 = vmaxss_avx(auVar184,ZEXT416((uint)(auVar248._0_4_ + -0.1)));
  auVar278 = vminss_avx(ZEXT416((uint)(auVar73._0_4_ + 0.1)),auVar278);
  auVar138._0_8_ = auVar91._0_8_;
  auVar138._8_8_ = auVar138._0_8_;
  auVar212._8_8_ = local_268._0_8_;
  auVar212._0_8_ = local_268._0_8_;
  auVar228._8_8_ = local_288._0_8_;
  auVar228._0_8_ = local_288._0_8_;
  auVar73 = vshufpd_avx(local_268._0_16_,local_268._0_16_,3);
  auVar134 = vshufpd_avx(local_288._0_16_,local_288._0_16_,3);
  auVar238 = vshufps_avx(auVar248,auVar278,0);
  auVar91 = vsubps_avx(auVar97,auVar238);
  local_438._0_4_ = auVar109._0_4_;
  local_438._4_4_ = auVar109._4_4_;
  fStack_430 = auVar109._8_4_;
  fStack_42c = auVar109._12_4_;
  fVar121 = auVar238._0_4_;
  auVar75._0_4_ = fVar121 * (float)local_438._0_4_;
  fVar85 = auVar238._4_4_;
  auVar75._4_4_ = fVar85 * (float)local_438._4_4_;
  fVar87 = auVar238._8_4_;
  auVar75._8_4_ = fVar87 * fStack_430;
  fVar144 = auVar238._12_4_;
  auVar75._12_4_ = fVar144 * fStack_42c;
  auVar173._0_4_ = fVar121 * auVar73._0_4_;
  auVar173._4_4_ = fVar85 * auVar73._4_4_;
  auVar173._8_4_ = fVar87 * auVar73._8_4_;
  auVar173._12_4_ = fVar144 * auVar73._12_4_;
  auVar185._0_4_ = fVar121 * auVar134._0_4_;
  auVar185._4_4_ = fVar85 * auVar134._4_4_;
  auVar185._8_4_ = fVar87 * auVar134._8_4_;
  auVar185._12_4_ = fVar144 * auVar134._12_4_;
  local_418._0_4_ = auVar92._0_4_;
  local_418._4_4_ = auVar92._4_4_;
  fStack_410 = auVar92._8_4_;
  fStack_40c = auVar92._12_4_;
  auVar200._0_4_ = fVar121 * (float)local_418._0_4_;
  auVar200._4_4_ = fVar85 * (float)local_418._4_4_;
  auVar200._8_4_ = fVar87 * fStack_410;
  auVar200._12_4_ = fVar144 * fStack_40c;
  auVar73 = vfmadd231ps_fma(auVar75,auVar91,auVar138);
  auVar134 = vfmadd231ps_fma(auVar173,auVar91,auVar212);
  auVar238 = vfmadd231ps_fma(auVar185,auVar91,auVar228);
  auVar91 = vfmadd231ps_fma(auVar200,auVar91,ZEXT816(0));
  auVar109 = vmovshdup_avx(auVar68);
  auVar179 = vfmadd231ss_fma(ZEXT416((uint)(auVar109._0_4_ * auVar248._0_4_)),auVar68,
                             ZEXT416((uint)(1.0 - auVar248._0_4_)));
  auVar195 = vfmadd231ss_fma(ZEXT416((uint)(auVar109._0_4_ * auVar278._0_4_)),auVar68,
                             ZEXT416((uint)(1.0 - auVar278._0_4_)));
  fVar121 = 1.0 / fVar86;
  auVar278 = vsubps_avx(auVar134,auVar73);
  auVar213._0_4_ = auVar278._0_4_ * 3.0;
  auVar213._4_4_ = auVar278._4_4_ * 3.0;
  auVar213._8_4_ = auVar278._8_4_ * 3.0;
  auVar213._12_4_ = auVar278._12_4_ * 3.0;
  auVar278 = vsubps_avx(auVar238,auVar134);
  auVar229._0_4_ = auVar278._0_4_ * 3.0;
  auVar229._4_4_ = auVar278._4_4_ * 3.0;
  auVar229._8_4_ = auVar278._8_4_ * 3.0;
  auVar229._12_4_ = auVar278._12_4_ * 3.0;
  auVar278 = vsubps_avx(auVar91,auVar238);
  auVar239._0_4_ = auVar278._0_4_ * 3.0;
  auVar239._4_4_ = auVar278._4_4_ * 3.0;
  auVar239._8_4_ = auVar278._8_4_ * 3.0;
  auVar239._12_4_ = auVar278._12_4_ * 3.0;
  auVar109 = vminps_avx(auVar229,auVar239);
  auVar278 = vmaxps_avx(auVar229,auVar239);
  auVar109 = vminps_avx(auVar213,auVar109);
  auVar278 = vmaxps_avx(auVar213,auVar278);
  auVar92 = vshufpd_avx(auVar109,auVar109,3);
  auVar248 = vshufpd_avx(auVar278,auVar278,3);
  auVar109 = vminps_avx(auVar109,auVar92);
  auVar278 = vmaxps_avx(auVar278,auVar248);
  auVar230._0_4_ = auVar109._0_4_ * fVar121;
  auVar230._4_4_ = auVar109._4_4_ * fVar121;
  auVar230._8_4_ = auVar109._8_4_ * fVar121;
  auVar230._12_4_ = auVar109._12_4_ * fVar121;
  auVar214._0_4_ = auVar278._0_4_ * fVar121;
  auVar214._4_4_ = auVar278._4_4_ * fVar121;
  auVar214._8_4_ = auVar278._8_4_ * fVar121;
  auVar214._12_4_ = auVar278._12_4_ * fVar121;
  fVar121 = 1.0 / (auVar195._0_4_ - auVar179._0_4_);
  auVar278 = vshufpd_avx(auVar73,auVar73,3);
  auVar109 = vshufpd_avx(auVar134,auVar134,3);
  auVar92 = vshufpd_avx(auVar238,auVar238,3);
  auVar248 = vshufpd_avx(auVar91,auVar91,3);
  auVar278 = vsubps_avx(auVar278,auVar73);
  auVar73 = vsubps_avx(auVar109,auVar134);
  auVar134 = vsubps_avx(auVar92,auVar238);
  auVar248 = vsubps_avx(auVar248,auVar91);
  auVar109 = vminps_avx(auVar278,auVar73);
  auVar278 = vmaxps_avx(auVar278,auVar73);
  auVar92 = vminps_avx(auVar134,auVar248);
  auVar92 = vminps_avx(auVar109,auVar92);
  auVar109 = vmaxps_avx(auVar134,auVar248);
  auVar278 = vmaxps_avx(auVar278,auVar109);
  auVar262._0_4_ = fVar121 * auVar92._0_4_;
  auVar262._4_4_ = fVar121 * auVar92._4_4_;
  auVar262._8_4_ = fVar121 * auVar92._8_4_;
  auVar262._12_4_ = fVar121 * auVar92._12_4_;
  auVar249._0_4_ = fVar121 * auVar278._0_4_;
  auVar249._4_4_ = fVar121 * auVar278._4_4_;
  auVar249._8_4_ = fVar121 * auVar278._8_4_;
  auVar249._12_4_ = fVar121 * auVar278._12_4_;
  auVar248 = vinsertps_avx(auVar7,auVar179,0x10);
  auVar73 = vinsertps_avx(auVar8,auVar195,0x10);
  auVar240._0_4_ = (auVar248._0_4_ + auVar73._0_4_) * 0.5;
  auVar240._4_4_ = (auVar248._4_4_ + auVar73._4_4_) * 0.5;
  auVar240._8_4_ = (auVar248._8_4_ + auVar73._8_4_) * 0.5;
  auVar240._12_4_ = (auVar248._12_4_ + auVar73._12_4_) * 0.5;
  auVar76._4_4_ = auVar240._0_4_;
  auVar76._0_4_ = auVar240._0_4_;
  auVar76._8_4_ = auVar240._0_4_;
  auVar76._12_4_ = auVar240._0_4_;
  auVar278 = vfmadd213ps_fma(local_298,auVar76,auVar10);
  auVar109 = vfmadd213ps_fma(local_2a8,auVar76,auVar11);
  auVar92 = vfmadd213ps_fma(local_2b8,auVar76,local_3f8);
  auVar8 = vsubps_avx(auVar109,auVar278);
  auVar278 = vfmadd213ps_fma(auVar8,auVar76,auVar278);
  auVar8 = vsubps_avx(auVar92,auVar109);
  auVar8 = vfmadd213ps_fma(auVar8,auVar76,auVar109);
  auVar8 = vsubps_avx(auVar8,auVar278);
  auVar278 = vfmadd231ps_fma(auVar278,auVar8,auVar76);
  auVar77._0_8_ = CONCAT44(auVar8._4_4_ * 3.0,auVar8._0_4_ * 3.0);
  auVar77._8_4_ = auVar8._8_4_ * 3.0;
  auVar77._12_4_ = auVar8._12_4_ * 3.0;
  auVar272._8_8_ = auVar278._0_8_;
  auVar272._0_8_ = auVar278._0_8_;
  auVar8 = vshufpd_avx(auVar278,auVar278,3);
  auVar278 = vshufps_avx(auVar240,auVar240,0x55);
  auVar238 = vsubps_avx(auVar8,auVar272);
  auVar133 = vfmadd231ps_fma(auVar272,auVar278,auVar238);
  auVar279._8_8_ = auVar77._0_8_;
  auVar279._0_8_ = auVar77._0_8_;
  auVar8 = vshufpd_avx(auVar77,auVar77,3);
  auVar8 = vsubps_avx(auVar8,auVar279);
  auVar91 = vfmadd213ps_fma(auVar8,auVar278,auVar279);
  auVar278 = vmovshdup_avx(auVar91);
  auVar280._0_8_ = auVar278._0_8_ ^ 0x8000000080000000;
  auVar280._8_4_ = auVar278._8_4_ ^ 0x80000000;
  auVar280._12_4_ = auVar278._12_4_ ^ 0x80000000;
  auVar109 = vmovshdup_avx(auVar238);
  auVar8 = vunpcklps_avx(auVar109,auVar280);
  auVar92 = vshufps_avx(auVar8,auVar280,4);
  auVar134 = vshufps_avx(auVar240,auVar240,0x54);
  auVar128._0_8_ = auVar238._0_8_ ^ 0x8000000080000000;
  auVar128._8_4_ = auVar238._8_4_ ^ 0x80000000;
  auVar128._12_4_ = auVar238._12_4_ ^ 0x80000000;
  auVar8 = vmovlhps_avx(auVar128,auVar91);
  auVar8 = vshufps_avx(auVar8,auVar91,8);
  auVar278 = vfmsub231ss_fma(ZEXT416((uint)(auVar238._0_4_ * auVar278._0_4_)),auVar109,auVar91);
  uVar63 = auVar278._0_4_;
  auVar78._4_4_ = uVar63;
  auVar78._0_4_ = uVar63;
  auVar78._8_4_ = uVar63;
  auVar78._12_4_ = uVar63;
  auVar278 = vdivps_avx(auVar92,auVar78);
  auVar109 = vdivps_avx(auVar8,auVar78);
  fVar87 = auVar133._0_4_;
  fVar121 = auVar278._0_4_;
  auVar8 = vshufps_avx(auVar133,auVar133,0x55);
  fVar85 = auVar109._0_4_;
  auVar79._0_4_ = fVar87 * fVar121 + auVar8._0_4_ * fVar85;
  auVar79._4_4_ = fVar87 * auVar278._4_4_ + auVar8._4_4_ * auVar109._4_4_;
  auVar79._8_4_ = fVar87 * auVar278._8_4_ + auVar8._8_4_ * auVar109._8_4_;
  auVar79._12_4_ = fVar87 * auVar278._12_4_ + auVar8._12_4_ * auVar109._12_4_;
  auVar146 = vsubps_avx(auVar134,auVar79);
  auVar134 = vmovshdup_avx(auVar278);
  auVar8 = vinsertps_avx(auVar230,auVar262,0x1c);
  auVar152._0_4_ = auVar134._0_4_ * auVar8._0_4_;
  auVar152._4_4_ = auVar134._4_4_ * auVar8._4_4_;
  auVar152._8_4_ = auVar134._8_4_ * auVar8._8_4_;
  auVar152._12_4_ = auVar134._12_4_ * auVar8._12_4_;
  auVar92 = vinsertps_avx(auVar214,auVar249,0x1c);
  auVar98._0_4_ = auVar92._0_4_ * auVar134._0_4_;
  auVar98._4_4_ = auVar92._4_4_ * auVar134._4_4_;
  auVar98._8_4_ = auVar92._8_4_ * auVar134._8_4_;
  auVar98._12_4_ = auVar92._12_4_ * auVar134._12_4_;
  auVar133 = vminps_avx(auVar152,auVar98);
  auVar91 = vmaxps_avx(auVar98,auVar152);
  auVar134 = vinsertps_avx(auVar262,auVar230,0x4c);
  auVar124 = vmovshdup_avx(auVar109);
  auVar238 = vinsertps_avx(auVar249,auVar214,0x4c);
  auVar250._0_4_ = auVar124._0_4_ * auVar134._0_4_;
  auVar250._4_4_ = auVar124._4_4_ * auVar134._4_4_;
  auVar250._8_4_ = auVar124._8_4_ * auVar134._8_4_;
  auVar250._12_4_ = auVar124._12_4_ * auVar134._12_4_;
  auVar231._0_4_ = auVar124._0_4_ * auVar238._0_4_;
  auVar231._4_4_ = auVar124._4_4_ * auVar238._4_4_;
  auVar231._8_4_ = auVar124._8_4_ * auVar238._8_4_;
  auVar231._12_4_ = auVar124._12_4_ * auVar238._12_4_;
  auVar124 = vminps_avx(auVar250,auVar231);
  auVar263._0_4_ = auVar133._0_4_ + auVar124._0_4_;
  auVar263._4_4_ = auVar133._4_4_ + auVar124._4_4_;
  auVar263._8_4_ = auVar133._8_4_ + auVar124._8_4_;
  auVar263._12_4_ = auVar133._12_4_ + auVar124._12_4_;
  auVar133 = vmaxps_avx(auVar231,auVar250);
  auVar99._0_4_ = auVar133._0_4_ + auVar91._0_4_;
  auVar99._4_4_ = auVar133._4_4_ + auVar91._4_4_;
  auVar99._8_4_ = auVar133._8_4_ + auVar91._8_4_;
  auVar99._12_4_ = auVar133._12_4_ + auVar91._12_4_;
  auVar232._8_8_ = 0x3f80000000000000;
  auVar232._0_8_ = 0x3f80000000000000;
  auVar91 = vsubps_avx(auVar232,auVar99);
  auVar133 = vsubps_avx(auVar232,auVar263);
  auVar124 = vsubps_avx(auVar248,auVar240);
  auVar145 = vsubps_avx(auVar73,auVar240);
  auVar114._0_4_ = fVar121 * auVar8._0_4_;
  auVar114._4_4_ = fVar121 * auVar8._4_4_;
  auVar114._8_4_ = fVar121 * auVar8._8_4_;
  auVar114._12_4_ = fVar121 * auVar8._12_4_;
  auVar264._0_4_ = fVar121 * auVar92._0_4_;
  auVar264._4_4_ = fVar121 * auVar92._4_4_;
  auVar264._8_4_ = fVar121 * auVar92._8_4_;
  auVar264._12_4_ = fVar121 * auVar92._12_4_;
  auVar92 = vminps_avx(auVar114,auVar264);
  auVar8 = vmaxps_avx(auVar264,auVar114);
  auVar153._0_4_ = fVar85 * auVar134._0_4_;
  auVar153._4_4_ = fVar85 * auVar134._4_4_;
  auVar153._8_4_ = fVar85 * auVar134._8_4_;
  auVar153._12_4_ = fVar85 * auVar134._12_4_;
  auVar215._0_4_ = fVar85 * auVar238._0_4_;
  auVar215._4_4_ = fVar85 * auVar238._4_4_;
  auVar215._8_4_ = fVar85 * auVar238._8_4_;
  auVar215._12_4_ = fVar85 * auVar238._12_4_;
  auVar134 = vminps_avx(auVar153,auVar215);
  auVar265._0_4_ = auVar92._0_4_ + auVar134._0_4_;
  auVar265._4_4_ = auVar92._4_4_ + auVar134._4_4_;
  auVar265._8_4_ = auVar92._8_4_ + auVar134._8_4_;
  auVar265._12_4_ = auVar92._12_4_ + auVar134._12_4_;
  fVar257 = auVar124._0_4_;
  auVar273._0_4_ = fVar257 * auVar91._0_4_;
  fVar258 = auVar124._4_4_;
  auVar273._4_4_ = fVar258 * auVar91._4_4_;
  fVar189 = auVar124._8_4_;
  auVar273._8_4_ = fVar189 * auVar91._8_4_;
  fVar190 = auVar124._12_4_;
  auVar273._12_4_ = fVar190 * auVar91._12_4_;
  auVar92 = vmaxps_avx(auVar215,auVar153);
  auVar216._0_4_ = fVar257 * auVar133._0_4_;
  auVar216._4_4_ = fVar258 * auVar133._4_4_;
  auVar216._8_4_ = fVar189 * auVar133._8_4_;
  auVar216._12_4_ = fVar190 * auVar133._12_4_;
  fVar87 = auVar145._0_4_;
  auVar100._0_4_ = fVar87 * auVar91._0_4_;
  fVar144 = auVar145._4_4_;
  auVar100._4_4_ = fVar144 * auVar91._4_4_;
  fVar64 = auVar145._8_4_;
  auVar100._8_4_ = fVar64 * auVar91._8_4_;
  fVar222 = auVar145._12_4_;
  auVar100._12_4_ = fVar222 * auVar91._12_4_;
  auVar233._0_4_ = fVar87 * auVar133._0_4_;
  auVar233._4_4_ = fVar144 * auVar133._4_4_;
  auVar233._8_4_ = fVar64 * auVar133._8_4_;
  auVar233._12_4_ = fVar222 * auVar133._12_4_;
  auVar115._0_4_ = auVar8._0_4_ + auVar92._0_4_;
  auVar115._4_4_ = auVar8._4_4_ + auVar92._4_4_;
  auVar115._8_4_ = auVar8._8_4_ + auVar92._8_4_;
  auVar115._12_4_ = auVar8._12_4_ + auVar92._12_4_;
  auVar154._8_8_ = 0x3f800000;
  auVar154._0_8_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar154,auVar115);
  auVar92 = vsubps_avx(auVar154,auVar265);
  auVar266._0_4_ = fVar257 * auVar8._0_4_;
  auVar266._4_4_ = fVar258 * auVar8._4_4_;
  auVar266._8_4_ = fVar189 * auVar8._8_4_;
  auVar266._12_4_ = fVar190 * auVar8._12_4_;
  auVar251._0_4_ = fVar257 * auVar92._0_4_;
  auVar251._4_4_ = fVar258 * auVar92._4_4_;
  auVar251._8_4_ = fVar189 * auVar92._8_4_;
  auVar251._12_4_ = fVar190 * auVar92._12_4_;
  auVar116._0_4_ = fVar87 * auVar8._0_4_;
  auVar116._4_4_ = fVar144 * auVar8._4_4_;
  auVar116._8_4_ = fVar64 * auVar8._8_4_;
  auVar116._12_4_ = fVar222 * auVar8._12_4_;
  auVar155._0_4_ = fVar87 * auVar92._0_4_;
  auVar155._4_4_ = fVar144 * auVar92._4_4_;
  auVar155._8_4_ = fVar64 * auVar92._8_4_;
  auVar155._12_4_ = fVar222 * auVar92._12_4_;
  auVar8 = vminps_avx(auVar266,auVar251);
  auVar92 = vminps_avx(auVar116,auVar155);
  auVar8 = vminps_avx(auVar8,auVar92);
  auVar92 = vmaxps_avx(auVar251,auVar266);
  auVar134 = vmaxps_avx(auVar155,auVar116);
  auVar238 = vminps_avx(auVar273,auVar216);
  auVar91 = vminps_avx(auVar100,auVar233);
  auVar238 = vminps_avx(auVar238,auVar91);
  auVar8 = vhaddps_avx(auVar8,auVar238);
  auVar92 = vmaxps_avx(auVar134,auVar92);
  auVar134 = vmaxps_avx(auVar216,auVar273);
  auVar238 = vmaxps_avx(auVar233,auVar100);
  auVar134 = vmaxps_avx(auVar238,auVar134);
  auVar92 = vhaddps_avx(auVar92,auVar134);
  auVar8 = vshufps_avx(auVar8,auVar8,0xe8);
  auVar92 = vshufps_avx(auVar92,auVar92,0xe8);
  auVar234._0_4_ = auVar146._0_4_ + auVar8._0_4_;
  auVar234._4_4_ = auVar146._4_4_ + auVar8._4_4_;
  auVar234._8_4_ = auVar146._8_4_ + auVar8._8_4_;
  auVar234._12_4_ = auVar146._12_4_ + auVar8._12_4_;
  auVar217._0_4_ = auVar146._0_4_ + auVar92._0_4_;
  auVar217._4_4_ = auVar146._4_4_ + auVar92._4_4_;
  auVar217._8_4_ = auVar146._8_4_ + auVar92._8_4_;
  auVar217._12_4_ = auVar146._12_4_ + auVar92._12_4_;
  auVar220 = ZEXT1664(auVar217);
  auVar8 = vmaxps_avx(auVar248,auVar234);
  auVar92 = vminps_avx(auVar217,auVar73);
  auVar8 = vcmpps_avx(auVar92,auVar8,1);
  auVar8 = vshufps_avx(auVar8,auVar8,0x50);
  if ((auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar8[0xf] < '\0')
  goto LAB_015aa16f;
  bVar55 = 0;
  if ((auVar188._0_4_ < auVar234._0_4_) && (bVar55 = 0, auVar217._0_4_ < auVar73._0_4_)) {
    auVar92 = vmovshdup_avx(auVar234);
    auVar8 = vcmpps_avx(auVar217,auVar73,1);
    bVar55 = auVar8[4] & auVar179._0_4_ < auVar92._0_4_;
  }
  if (((3 < (uint)uVar52 || fVar86 < 0.001) | bVar55) == 1) {
    lVar54 = 200;
    auVar220 = ZEXT1664(local_3f8);
    do {
      fVar144 = auVar146._0_4_;
      fVar87 = 1.0 - fVar144;
      fVar86 = fVar87 * fVar87 * fVar87;
      fVar88 = fVar144 * 3.0 * fVar87 * fVar87;
      fVar87 = fVar87 * fVar144 * fVar144 * 3.0;
      auVar139._4_4_ = fVar86;
      auVar139._0_4_ = fVar86;
      auVar139._8_4_ = fVar86;
      auVar139._12_4_ = fVar86;
      auVar117._4_4_ = fVar88;
      auVar117._0_4_ = fVar88;
      auVar117._8_4_ = fVar88;
      auVar117._12_4_ = fVar88;
      auVar101._4_4_ = fVar87;
      auVar101._0_4_ = fVar87;
      auVar101._8_4_ = fVar87;
      auVar101._12_4_ = fVar87;
      fVar144 = fVar144 * fVar144 * fVar144;
      auVar156._0_4_ = (float)local_2c8._0_4_ * fVar144;
      auVar156._4_4_ = (float)local_2c8._4_4_ * fVar144;
      auVar156._8_4_ = fStack_2c0 * fVar144;
      auVar156._12_4_ = fStack_2bc * fVar144;
      auVar7 = vfmadd231ps_fma(auVar156,local_3f8,auVar101);
      auVar7 = vfmadd231ps_fma(auVar7,auVar11,auVar117);
      auVar7 = vfmadd231ps_fma(auVar7,auVar10,auVar139);
      auVar102._8_8_ = auVar7._0_8_;
      auVar102._0_8_ = auVar7._0_8_;
      auVar7 = vshufpd_avx(auVar7,auVar7,3);
      auVar8 = vshufps_avx(auVar146,auVar146,0x55);
      auVar7 = vsubps_avx(auVar7,auVar102);
      auVar8 = vfmadd213ps_fma(auVar7,auVar8,auVar102);
      fVar86 = auVar8._0_4_;
      auVar7 = vshufps_avx(auVar8,auVar8,0x55);
      auVar103._0_4_ = fVar121 * fVar86 + fVar85 * auVar7._0_4_;
      auVar103._4_4_ = auVar278._4_4_ * fVar86 + auVar109._4_4_ * auVar7._4_4_;
      auVar103._8_4_ = auVar278._8_4_ * fVar86 + auVar109._8_4_ * auVar7._8_4_;
      auVar103._12_4_ = auVar278._12_4_ * fVar86 + auVar109._12_4_ * auVar7._12_4_;
      auVar146 = vsubps_avx(auVar146,auVar103);
      auVar7 = vandps_avx(auVar244,auVar8);
      auVar8 = vshufps_avx(auVar7,auVar7,0xf5);
      auVar7 = vmaxss_avx(auVar8,auVar7);
      if (auVar7._0_4_ < fVar84) {
        local_1b8 = auVar146._0_4_;
        if ((0.0 <= local_1b8) && (local_1b8 <= 1.0)) {
          auVar7 = vmovshdup_avx(auVar146);
          fVar86 = auVar7._0_4_;
          if ((0.0 <= fVar86) && (fVar86 <= 1.0)) {
            auVar7 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar134 = vinsertps_avx(auVar7,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                    );
            auVar7 = vdpps_avx(auVar134,local_448,0x7f);
            auVar8 = vdpps_avx(auVar134,local_458,0x7f);
            auVar278 = vdpps_avx(auVar134,local_2d8,0x7f);
            auVar109 = vdpps_avx(auVar134,local_2e8,0x7f);
            auVar92 = vdpps_avx(auVar134,local_2f8,0x7f);
            auVar248 = vdpps_avx(auVar134,local_308,0x7f);
            auVar73 = vdpps_avx(auVar134,local_318,0x7f);
            auVar134 = vdpps_avx(auVar134,local_328,0x7f);
            fVar88 = 1.0 - fVar86;
            auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar92._0_4_)),ZEXT416((uint)fVar88),
                                     auVar7);
            auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar248._0_4_ * fVar86)),ZEXT416((uint)fVar88),
                                     auVar8);
            auVar278 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar86)),ZEXT416((uint)fVar88)
                                       ,auVar278);
            auVar220 = ZEXT1664(auVar278);
            auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar134._0_4_)),
                                       ZEXT416((uint)fVar88),auVar109);
            fVar85 = 1.0 - local_1b8;
            fVar86 = fVar85 * local_1b8 * local_1b8 * 3.0;
            fVar144 = local_1b8 * local_1b8 * local_1b8;
            auVar278 = vfmadd231ss_fma(ZEXT416((uint)(auVar109._0_4_ * fVar144)),
                                       ZEXT416((uint)fVar86),auVar278);
            fVar88 = local_1b8 * 3.0 * fVar85 * fVar85;
            auVar8 = vfmadd231ss_fma(auVar278,ZEXT416((uint)fVar88),auVar8);
            fVar121 = fVar85 * fVar85 * fVar85;
            auVar7 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar121),auVar7);
            fVar87 = auVar7._0_4_;
            if ((fVar62 <= fVar87) && (fVar64 = *(float *)(ray + k * 4 + 0x80), fVar87 <= fVar64)) {
              pGVar3 = (pRVar49->scene->geometries).items[uVar50].ptr;
              if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar61 = false;
              }
              else if ((pRVar49->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar61 = true, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_1a8 = vshufps_avx(auVar146,auVar146,0x55);
                auVar201._8_4_ = 0x3f800000;
                auVar201._0_8_ = 0x3f8000003f800000;
                auVar201._12_4_ = 0x3f800000;
                auVar7 = vsubps_avx(auVar201,local_1a8);
                fVar222 = local_1a8._0_4_;
                auVar218._0_4_ = fVar222 * (float)local_478._0_4_;
                fVar257 = local_1a8._4_4_;
                auVar218._4_4_ = fVar257 * (float)local_478._4_4_;
                fVar258 = local_1a8._8_4_;
                auVar218._8_4_ = fVar258 * fStack_470;
                fVar189 = local_1a8._12_4_;
                auVar218._12_4_ = fVar189 * fStack_46c;
                auVar235._0_4_ = fVar222 * (float)local_4b8._0_4_;
                auVar235._4_4_ = fVar257 * (float)local_4b8._4_4_;
                auVar235._8_4_ = fVar258 * fStack_4b0;
                auVar235._12_4_ = fVar189 * fStack_4ac;
                auVar241._0_4_ = fVar222 * (float)local_4c8._0_4_;
                auVar241._4_4_ = fVar257 * (float)local_4c8._4_4_;
                auVar241._8_4_ = fVar258 * fStack_4c0;
                auVar241._12_4_ = fVar189 * fStack_4bc;
                auVar252._0_4_ = fVar222 * fVar159;
                auVar252._4_4_ = fVar257 * fVar176;
                auVar252._8_4_ = fVar258 * fVar177;
                auVar252._12_4_ = fVar189 * fVar178;
                auVar8 = vfmadd231ps_fma(auVar218,auVar7,local_468);
                auVar278 = vfmadd231ps_fma(auVar235,auVar7,local_498);
                auVar109 = vfmadd231ps_fma(auVar241,auVar7,local_4a8);
                auVar92 = vfmadd231ps_fma(auVar252,auVar7,local_488);
                auVar7 = vsubps_avx(auVar278,auVar8);
                auVar8 = vsubps_avx(auVar109,auVar278);
                auVar220 = ZEXT1664(auVar8);
                auVar278 = vsubps_avx(auVar92,auVar109);
                auVar242._0_4_ = auVar8._0_4_ * local_1b8;
                auVar242._4_4_ = auVar8._4_4_ * local_1b8;
                auVar242._8_4_ = auVar8._8_4_ * local_1b8;
                auVar242._12_4_ = auVar8._12_4_ * local_1b8;
                auVar174._4_4_ = fVar85;
                auVar174._0_4_ = fVar85;
                auVar174._8_4_ = fVar85;
                auVar174._12_4_ = fVar85;
                auVar7 = vfmadd231ps_fma(auVar242,auVar174,auVar7);
                auVar202._0_4_ = auVar278._0_4_ * local_1b8;
                auVar202._4_4_ = auVar278._4_4_ * local_1b8;
                auVar202._8_4_ = auVar278._8_4_ * local_1b8;
                auVar202._12_4_ = auVar278._12_4_ * local_1b8;
                auVar278 = vfmadd231ps_fma(auVar202,auVar174,auVar8);
                auVar203._0_4_ = auVar278._0_4_ * local_1b8;
                auVar203._4_4_ = auVar278._4_4_ * local_1b8;
                auVar203._8_4_ = auVar278._8_4_ * local_1b8;
                auVar203._12_4_ = auVar278._12_4_ * local_1b8;
                auVar278 = vfmadd231ps_fma(auVar203,auVar174,auVar7);
                auVar157._0_4_ = fVar144 * (float)local_3a8._0_4_;
                auVar157._4_4_ = fVar144 * (float)local_3a8._4_4_;
                auVar157._8_4_ = fVar144 * fStack_3a0;
                auVar157._12_4_ = fVar144 * fStack_39c;
                auVar118._4_4_ = fVar86;
                auVar118._0_4_ = fVar86;
                auVar118._8_4_ = fVar86;
                auVar118._12_4_ = fVar86;
                auVar7 = vfmadd132ps_fma(auVar118,auVar157,local_398);
                auVar140._4_4_ = fVar88;
                auVar140._0_4_ = fVar88;
                auVar140._8_4_ = fVar88;
                auVar140._12_4_ = fVar88;
                auVar7 = vfmadd132ps_fma(auVar140,auVar7,local_388);
                auVar119._0_4_ = auVar278._0_4_ * 3.0;
                auVar119._4_4_ = auVar278._4_4_ * 3.0;
                auVar119._8_4_ = auVar278._8_4_ * 3.0;
                auVar119._12_4_ = auVar278._12_4_ * 3.0;
                auVar129._4_4_ = fVar121;
                auVar129._0_4_ = fVar121;
                auVar129._8_4_ = fVar121;
                auVar129._12_4_ = fVar121;
                auVar278 = vfmadd132ps_fma(auVar129,auVar7,local_378);
                auVar7 = vshufps_avx(auVar119,auVar119,0xc9);
                auVar141._0_4_ = auVar278._0_4_ * auVar7._0_4_;
                auVar141._4_4_ = auVar278._4_4_ * auVar7._4_4_;
                auVar141._8_4_ = auVar278._8_4_ * auVar7._8_4_;
                auVar141._12_4_ = auVar278._12_4_ * auVar7._12_4_;
                auVar7 = vshufps_avx(auVar278,auVar278,0xc9);
                auVar278 = vfmsub231ps_fma(auVar141,auVar119,auVar7);
                auVar7 = vshufps_avx(auVar278,auVar278,0x55);
                local_1e8[0] = (RTCHitN)auVar7[0];
                local_1e8[1] = (RTCHitN)auVar7[1];
                local_1e8[2] = (RTCHitN)auVar7[2];
                local_1e8[3] = (RTCHitN)auVar7[3];
                local_1e8[4] = (RTCHitN)auVar7[4];
                local_1e8[5] = (RTCHitN)auVar7[5];
                local_1e8[6] = (RTCHitN)auVar7[6];
                local_1e8[7] = (RTCHitN)auVar7[7];
                local_1e8[8] = (RTCHitN)auVar7[8];
                local_1e8[9] = (RTCHitN)auVar7[9];
                local_1e8[10] = (RTCHitN)auVar7[10];
                local_1e8[0xb] = (RTCHitN)auVar7[0xb];
                local_1e8[0xc] = (RTCHitN)auVar7[0xc];
                local_1e8[0xd] = (RTCHitN)auVar7[0xd];
                local_1e8[0xe] = (RTCHitN)auVar7[0xe];
                local_1e8[0xf] = (RTCHitN)auVar7[0xf];
                local_1d8 = vshufps_avx(auVar278,auVar278,0xaa);
                local_1c8 = auVar278._0_4_;
                uStack_1c4 = local_1c8;
                uStack_1c0 = local_1c8;
                uStack_1bc = local_1c8;
                fStack_1b4 = local_1b8;
                fStack_1b0 = local_1b8;
                fStack_1ac = local_1b8;
                local_198 = CONCAT44(uStack_364,local_368);
                uStack_190 = CONCAT44(uStack_35c,uStack_360);
                local_188._4_4_ = uStack_354;
                local_188._0_4_ = local_358;
                local_188._8_4_ = uStack_350;
                local_188._12_4_ = uStack_34c;
                vpcmpeqd_avx2(ZEXT1632(local_188),ZEXT1632(local_188));
                uStack_174 = pRVar49->user->instID[0];
                local_178 = uStack_174;
                uStack_170 = uStack_174;
                uStack_16c = uStack_174;
                uStack_168 = pRVar49->user->instPrimID[0];
                uStack_164 = uStack_168;
                uStack_160 = uStack_168;
                uStack_15c = uStack_168;
                *(float *)(ray + k * 4 + 0x80) = fVar87;
                local_508 = *local_4f8;
                local_3d8.valid = (int *)local_508;
                local_3d8.geometryUserPtr = pGVar3->userPtr;
                local_3d8.context = pRVar49->user;
                local_3d8.ray = (RTCRayN *)ray;
                local_3d8.hit = local_1e8;
                local_3d8.N = 4;
                if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar220 = ZEXT1664(auVar8);
                  (*pGVar3->occlusionFilterN)(&local_3d8);
                }
                if (local_508 == (undefined1  [16])0x0) {
                  auVar7 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar7 = auVar7 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var4 = pRVar49->args->filter;
                  if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                     (((pRVar49->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar220 = ZEXT1664(auVar220._0_16_);
                    (*p_Var4)(&local_3d8);
                  }
                  auVar8 = vpcmpeqd_avx(local_508,_DAT_01f7aa10);
                  auVar7 = auVar8 ^ _DAT_01f7ae20;
                  auVar120._8_4_ = 0xff800000;
                  auVar120._0_8_ = 0xff800000ff800000;
                  auVar120._12_4_ = 0xff800000;
                  auVar8 = vblendvps_avx(auVar120,*(undefined1 (*) [16])(local_3d8.ray + 0x80),
                                         auVar8);
                  *(undefined1 (*) [16])(local_3d8.ray + 0x80) = auVar8;
                }
                auVar104._8_8_ = 0x100000001;
                auVar104._0_8_ = 0x100000001;
                bVar61 = (auVar104 & auVar7) != (undefined1  [16])0x0;
                if (!bVar61) {
                  *(float *)(ray + k * 4 + 0x80) = fVar64;
                }
              }
              bVar59 = (bool)(bVar59 | bVar61);
            }
          }
        }
        break;
      }
      lVar54 = lVar54 + -1;
    } while (lVar54 != 0);
    goto LAB_015aa16f;
  }
  local_338 = vinsertps_avx(auVar7,ZEXT416((uint)fVar88),0x10);
  auVar68 = vinsertps_avx(auVar179,ZEXT416((uint)auVar195._0_4_),0x10);
  goto LAB_015a9bbb;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }